

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unaryop_x86_avx.cpp
# Opt level: O0

int ncnn::unary_op_inplace<ncnn::UnaryOp_x86_avx_functor::unary_op_tan>(Mat *a,Option *opt)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [32];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [24];
  undefined1 auVar54 [24];
  undefined1 auVar55 [24];
  undefined8 uVar56;
  undefined8 uVar57;
  undefined8 uVar58;
  undefined8 uVar59;
  undefined8 uVar60;
  undefined8 uVar61;
  undefined8 uVar62;
  undefined8 uVar63;
  undefined8 uVar64;
  undefined8 uVar65;
  undefined8 uVar66;
  undefined8 uVar67;
  undefined8 uVar68;
  undefined8 uVar69;
  undefined8 uVar70;
  undefined8 uVar71;
  undefined8 uVar72;
  undefined8 uVar73;
  undefined8 uVar74;
  undefined8 uVar75;
  undefined8 uVar76;
  undefined8 uVar77;
  undefined8 uVar78;
  undefined8 uVar79;
  undefined8 uVar80;
  undefined8 uVar81;
  undefined8 uVar82;
  undefined8 uVar83;
  undefined8 uVar84;
  undefined8 uVar85;
  undefined8 uVar86;
  undefined8 uVar87;
  long *in_RDI;
  float fVar88;
  float fVar89;
  float fVar90;
  float fVar91;
  float fVar92;
  float fVar93;
  float fVar94;
  float fVar95;
  float fVar96;
  float fVar97;
  float fVar98;
  float fVar99;
  float fVar100;
  __m128 _p_1;
  __m256 _p;
  int i;
  float *ptr;
  int q;
  int size;
  int elempack;
  int channels;
  int d;
  int h;
  int w;
  unary_op_tan op;
  Mat *m;
  __m256 ytan;
  __m256 _tmp;
  __m256 mask;
  __m256 eps;
  __m256 ycos;
  __m256 ysin;
  __m256 ysin1;
  __m256 ysin2;
  __m256 y2;
  __m256 z;
  __m256 sign_bit_cos;
  imm_xmm_union u_4;
  __m256 poly_mask;
  __m256 swap_sign_bit_sin;
  imm_xmm_union u_3;
  imm_xmm_union u_2;
  imm_xmm_union u_1;
  imm_xmm_union u;
  __m128i imm4_2;
  __m128i imm4_1;
  __m128i imm2_2;
  __m128i imm2_1;
  __m128i imm0_2;
  __m128i imm0_1;
  __m256i imm4;
  __m256i imm2;
  __m256i imm0;
  __m256 y;
  __m256 sign_bit_sin;
  __m256 xmm3;
  __m256 xmm2;
  __m256 xmm1;
  __m128 ytan_1;
  __m128 _tmp_1;
  __m128 mask_1;
  __m128 eps_1;
  __m128 ycos_1;
  __m128 ysin_1;
  v4sf ysin1_1;
  v4sf ysin2_1;
  v4sf y2_1;
  v4sf z_1;
  v4sf sign_bit_cos_1;
  v4sf poly_mask_1;
  v4sf swap_sign_bit_sin_1;
  v4si emm4;
  v4si emm2;
  v4si emm0;
  v4sf y_1;
  v4sf sign_bit_sin_1;
  v4sf xmm3_1;
  v4sf xmm2_1;
  v4sf xmm1_1;
  undefined8 local_1db0;
  undefined8 uStack_1da8;
  undefined8 local_1da0;
  undefined8 uStack_1d98;
  undefined8 uStack_1d90;
  undefined8 uStack_1d88;
  int local_1d7c;
  undefined8 local_1d78;
  undefined8 local_1d70;
  undefined8 local_1d68;
  undefined4 local_1d60;
  long local_1d58;
  undefined4 local_1d50;
  undefined4 local_1d4c;
  undefined4 local_1d48;
  undefined4 local_1d44;
  undefined4 local_1d40;
  undefined8 local_1d38;
  undefined1 (*local_1d30) [32];
  int local_1d28;
  int local_1d24;
  int local_1d20;
  int local_1d1c;
  int local_1d18;
  int local_1d14;
  int local_1d10;
  undefined1 local_1d09 [9];
  long *local_1d00;
  undefined1 local_1cf5;
  int local_1cf4;
  undefined8 *local_1ce8;
  undefined8 *local_1ce0;
  undefined8 *local_1cd0;
  undefined1 (*local_1cc8) [32];
  undefined8 local_1cc0;
  undefined8 uStack_1cb8;
  undefined8 uStack_1cb0;
  undefined8 uStack_1ca8;
  undefined1 (*local_1c90) [32];
  undefined1 (*local_1c88) [32];
  undefined8 local_1c80;
  undefined8 uStack_1c78;
  undefined1 (*local_1c70) [32];
  long local_1c68;
  undefined4 local_1c5c;
  long local_1c58;
  undefined1 (*local_1c50) [32];
  undefined4 local_1c44;
  int local_1c40;
  int local_1c3c;
  undefined8 *local_1c38;
  undefined4 local_1c2c;
  long local_1c28;
  undefined8 *local_1c18;
  undefined8 *local_1bf0;
  undefined1 *local_1be8;
  undefined8 *local_1be0;
  undefined1 *local_1bd8;
  undefined1 (*local_1bd0) [32];
  undefined1 *local_1bc8;
  undefined1 local_1bc0 [32];
  undefined1 local_1ba0 [32];
  undefined1 local_1b80 [32];
  undefined8 local_1b60;
  undefined8 uStack_1b58;
  undefined8 uStack_1b50;
  undefined8 uStack_1b48;
  float local_1b40;
  float fStack_1b3c;
  float fStack_1b38;
  float fStack_1b34;
  float fStack_1b30;
  float fStack_1b2c;
  float fStack_1b28;
  float fStack_1b24;
  undefined1 local_1b20 [32];
  undefined8 local_1b00;
  undefined8 uStack_1af8;
  undefined8 uStack_1af0;
  undefined8 uStack_1ae8;
  undefined8 local_1ae0;
  undefined8 uStack_1ad8;
  undefined8 uStack_1ad0;
  undefined8 uStack_1ac8;
  undefined8 local_1ac0;
  undefined8 uStack_1ab8;
  undefined8 uStack_1ab0;
  undefined8 uStack_1aa8;
  undefined1 local_1aa0 [32];
  undefined8 local_1a80;
  undefined8 uStack_1a78;
  undefined8 uStack_1a70;
  undefined8 uStack_1a68;
  undefined8 local_1a60;
  undefined8 uStack_1a58;
  undefined8 uStack_1a50;
  undefined8 uStack_1a48;
  undefined4 local_1a24;
  undefined1 local_1a20 [32];
  undefined1 local_1a00 [32];
  undefined1 local_19e0 [8];
  undefined8 uStack_19d8;
  undefined8 uStack_19d0;
  undefined8 uStack_19c8;
  float local_19c0;
  float fStack_19bc;
  float fStack_19b8;
  float fStack_19b4;
  float fStack_19b0;
  float fStack_19ac;
  float fStack_19a8;
  float fStack_19a4;
  undefined8 local_19a0;
  undefined8 uStack_1998;
  undefined8 uStack_1990;
  undefined8 uStack_1988;
  undefined8 local_1980;
  undefined8 uStack_1978;
  undefined8 uStack_1970;
  undefined8 uStack_1968;
  undefined8 local_1960;
  undefined8 uStack_1958;
  undefined8 uStack_1950;
  undefined8 uStack_1948;
  undefined8 local_1940;
  undefined8 uStack_1938;
  undefined8 uStack_1930;
  undefined8 uStack_1928;
  undefined8 local_1920;
  undefined8 uStack_1918;
  undefined8 uStack_1910;
  undefined8 uStack_1908;
  undefined8 local_1900;
  undefined8 uStack_18f8;
  undefined8 uStack_18f0;
  undefined8 uStack_18e8;
  undefined8 local_18e0;
  undefined8 uStack_18d8;
  undefined8 uStack_18d0;
  undefined8 uStack_18c8;
  int local_18c0;
  int iStack_18bc;
  int iStack_18b8;
  int iStack_18b4;
  int iStack_18b0;
  int iStack_18ac;
  int iStack_18a8;
  int iStack_18a4;
  undefined1 local_18a0 [16];
  undefined1 local_1890 [16];
  undefined1 local_1880 [16];
  undefined1 local_1870 [16];
  undefined1 local_1860 [16];
  undefined1 local_1850 [16];
  undefined8 local_1840;
  undefined8 uStack_1838;
  undefined8 uStack_1830;
  undefined8 uStack_1828;
  undefined8 local_1820;
  undefined8 uStack_1818;
  undefined8 uStack_1810;
  undefined8 uStack_1808;
  undefined8 local_1800;
  undefined8 uStack_17f8;
  undefined8 uStack_17f0;
  undefined8 uStack_17e8;
  undefined1 local_17e0 [8];
  undefined8 uStack_17d8;
  undefined8 uStack_17d0;
  undefined8 uStack_17c8;
  undefined8 local_17c0;
  undefined8 uStack_17b8;
  undefined8 uStack_17b0;
  undefined8 uStack_17a8;
  undefined8 local_17a0;
  undefined8 uStack_1798;
  undefined8 uStack_1790;
  undefined8 uStack_1788;
  undefined8 local_1780;
  undefined8 uStack_1778;
  undefined8 uStack_1770;
  undefined8 uStack_1768;
  undefined8 local_1760;
  undefined8 uStack_1758;
  undefined8 uStack_1750;
  undefined8 uStack_1748;
  float *local_1730;
  undefined1 *local_1728;
  undefined8 local_1720;
  undefined8 uStack_1718;
  undefined8 uStack_1710;
  undefined8 uStack_1708;
  undefined8 local_1700;
  undefined8 uStack_16f8;
  undefined8 uStack_16f0;
  undefined8 uStack_16e8;
  undefined8 local_16e0;
  undefined8 uStack_16d8;
  undefined8 uStack_16d0;
  undefined8 uStack_16c8;
  undefined8 local_16c0;
  undefined8 uStack_16b8;
  undefined8 uStack_16b0;
  undefined8 uStack_16a8;
  undefined8 local_16a0;
  undefined8 uStack_1698;
  undefined8 uStack_1690;
  undefined8 uStack_1688;
  undefined8 local_1680;
  undefined8 uStack_1678;
  undefined8 uStack_1670;
  undefined8 uStack_1668;
  undefined8 local_1660;
  undefined8 uStack_1658;
  undefined8 uStack_1650;
  undefined8 uStack_1648;
  undefined8 local_1640;
  undefined8 uStack_1638;
  undefined8 uStack_1630;
  undefined8 uStack_1628;
  undefined8 local_1620;
  undefined8 uStack_1618;
  undefined8 uStack_1610;
  undefined8 uStack_1608;
  undefined8 local_1600;
  undefined8 uStack_15f8;
  undefined8 uStack_15f0;
  undefined8 uStack_15e8;
  undefined8 local_15e0;
  undefined8 uStack_15d8;
  undefined8 uStack_15d0;
  undefined8 uStack_15c8;
  undefined8 local_15c0;
  undefined8 uStack_15b8;
  undefined8 uStack_15b0;
  undefined8 uStack_15a8;
  undefined8 local_15a0;
  undefined8 uStack_1598;
  undefined8 uStack_1590;
  undefined8 uStack_1588;
  undefined8 local_1580;
  undefined8 uStack_1578;
  undefined8 uStack_1570;
  undefined8 uStack_1568;
  undefined1 local_1560 [32];
  undefined8 local_1540;
  undefined8 uStack_1538;
  undefined8 uStack_1530;
  undefined8 uStack_1528;
  undefined8 local_1520;
  undefined8 uStack_1518;
  undefined8 uStack_1510;
  undefined8 uStack_1508;
  undefined8 local_1500;
  undefined8 uStack_14f8;
  undefined8 uStack_14f0;
  undefined8 uStack_14e8;
  undefined8 local_14e0;
  undefined8 uStack_14d8;
  undefined8 uStack_14d0;
  undefined8 uStack_14c8;
  undefined8 local_14c0;
  undefined8 uStack_14b8;
  undefined8 uStack_14b0;
  undefined8 uStack_14a8;
  undefined8 local_14a0;
  undefined8 uStack_1498;
  undefined8 uStack_1490;
  undefined8 uStack_1488;
  undefined8 local_1480;
  undefined8 uStack_1478;
  undefined8 uStack_1470;
  undefined8 uStack_1468;
  undefined8 local_1460;
  undefined8 uStack_1458;
  undefined8 uStack_1450;
  undefined8 uStack_1448;
  undefined8 local_1440;
  undefined8 uStack_1438;
  undefined8 uStack_1430;
  undefined8 uStack_1428;
  undefined8 local_1420;
  undefined8 uStack_1418;
  undefined8 uStack_1410;
  undefined8 uStack_1408;
  undefined8 *local_13f8;
  undefined8 *local_13f0;
  undefined1 *local_13e8;
  undefined8 local_13e0;
  undefined8 uStack_13d8;
  undefined8 uStack_13d0;
  undefined8 uStack_13c8;
  undefined8 local_13c0;
  undefined8 uStack_13b8;
  undefined8 uStack_13b0;
  undefined8 uStack_13a8;
  float *local_1398;
  float *local_1390;
  undefined1 *local_1388;
  undefined8 local_1380;
  undefined8 uStack_1378;
  undefined8 uStack_1370;
  undefined8 uStack_1368;
  undefined8 local_1360;
  undefined8 uStack_1358;
  undefined8 uStack_1350;
  undefined8 uStack_1348;
  float *local_1338;
  float *local_1330;
  undefined1 *local_1328;
  undefined8 local_1320;
  undefined8 uStack_1318;
  undefined8 uStack_1310;
  undefined8 uStack_1308;
  undefined8 local_1300;
  undefined8 uStack_12f8;
  undefined8 uStack_12f0;
  undefined8 uStack_12e8;
  float *local_12d8;
  float *local_12d0;
  undefined1 *local_12c8;
  undefined8 local_12c0;
  undefined8 uStack_12b8;
  undefined8 uStack_12b0;
  undefined8 uStack_12a8;
  undefined8 local_12a0;
  undefined8 uStack_1298;
  undefined8 uStack_1290;
  undefined8 uStack_1288;
  float *local_1278;
  float *local_1270;
  undefined1 *local_1268;
  undefined8 local_1260;
  undefined8 uStack_1258;
  undefined8 uStack_1250;
  undefined8 uStack_1248;
  undefined8 local_1240;
  undefined8 uStack_1238;
  undefined8 uStack_1230;
  undefined8 uStack_1228;
  undefined8 *local_1218;
  undefined8 *local_1210;
  undefined1 *local_1208;
  undefined8 local_1200;
  undefined8 uStack_11f8;
  undefined8 uStack_11f0;
  undefined8 uStack_11e8;
  undefined8 local_11e0;
  undefined8 uStack_11d8;
  undefined8 uStack_11d0;
  undefined8 uStack_11c8;
  undefined8 *local_11b8;
  undefined8 *local_11b0;
  undefined1 *local_11a8;
  undefined8 local_11a0;
  undefined8 uStack_1198;
  undefined8 uStack_1190;
  undefined8 uStack_1188;
  undefined8 local_1180;
  undefined8 uStack_1178;
  undefined8 uStack_1170;
  undefined8 uStack_1168;
  undefined8 *local_1158;
  undefined8 *local_1150;
  undefined1 *local_1148;
  undefined8 local_1140;
  undefined8 uStack_1138;
  undefined8 uStack_1130;
  undefined8 uStack_1128;
  undefined8 local_1120;
  undefined8 uStack_1118;
  undefined8 uStack_1110;
  undefined8 uStack_1108;
  undefined1 *local_10f8;
  float *local_10f0;
  float *local_10e8;
  float local_10e0;
  float fStack_10dc;
  float fStack_10d8;
  float fStack_10d4;
  float fStack_10d0;
  float fStack_10cc;
  float fStack_10c8;
  float fStack_10c4;
  undefined8 local_10c0;
  undefined8 uStack_10b8;
  undefined8 uStack_10b0;
  undefined8 uStack_10a8;
  float local_10a0 [2];
  float afStack_1098 [2];
  float afStack_1090 [2];
  float afStack_1088 [2];
  undefined8 local_1080;
  undefined8 uStack_1078;
  undefined8 uStack_1070;
  undefined8 uStack_1068;
  undefined8 local_1060;
  undefined8 uStack_1058;
  undefined8 uStack_1050;
  undefined8 uStack_1048;
  float local_1040;
  float fStack_103c;
  float fStack_1038;
  float fStack_1034;
  float fStack_1030;
  float fStack_102c;
  float fStack_1028;
  undefined4 uStack_1024;
  undefined8 local_1020;
  undefined8 uStack_1018;
  undefined8 uStack_1010;
  undefined8 uStack_1008;
  float local_1000;
  float fStack_ffc;
  float fStack_ff8;
  float fStack_ff4;
  float fStack_ff0;
  float fStack_fec;
  float fStack_fe8;
  undefined4 uStack_fe4;
  undefined8 local_fe0;
  undefined8 uStack_fd8;
  undefined8 uStack_fd0;
  undefined8 uStack_fc8;
  float local_fc0;
  float fStack_fbc;
  float fStack_fb8;
  float fStack_fb4;
  float fStack_fb0;
  float fStack_fac;
  float fStack_fa8;
  undefined4 uStack_fa4;
  float local_fa0 [2];
  float afStack_f98 [2];
  float afStack_f90 [2];
  float afStack_f88 [2];
  float local_f80;
  float fStack_f7c;
  float fStack_f78;
  float fStack_f74;
  float fStack_f70;
  float fStack_f6c;
  float fStack_f68;
  float fStack_f64;
  float local_f60 [2];
  float afStack_f58 [2];
  float afStack_f50 [2];
  float afStack_f48 [2];
  float local_f40;
  float fStack_f3c;
  float fStack_f38;
  float fStack_f34;
  float fStack_f30;
  float fStack_f2c;
  float fStack_f28;
  float fStack_f24;
  float local_f20 [2];
  float afStack_f18 [2];
  float afStack_f10 [2];
  float afStack_f08 [2];
  float local_f00;
  float fStack_efc;
  float fStack_ef8;
  float fStack_ef4;
  float fStack_ef0;
  float fStack_eec;
  float fStack_ee8;
  float fStack_ee4;
  float local_ee0 [2];
  float afStack_ed8 [2];
  float afStack_ed0 [2];
  float afStack_ec8 [2];
  float local_ec0;
  float fStack_ebc;
  float fStack_eb8;
  float fStack_eb4;
  float fStack_eb0;
  float fStack_eac;
  float fStack_ea8;
  float fStack_ea4;
  undefined8 local_ea0;
  undefined8 uStack_e98;
  undefined8 uStack_e90;
  undefined8 uStack_e88;
  float local_e80;
  float fStack_e7c;
  float fStack_e78;
  float fStack_e74;
  float fStack_e70;
  float fStack_e6c;
  float fStack_e68;
  float fStack_e64;
  undefined8 local_e60;
  undefined8 uStack_e58;
  undefined8 uStack_e50;
  undefined8 uStack_e48;
  undefined8 local_e40;
  undefined8 uStack_e38;
  undefined8 uStack_e30;
  undefined8 uStack_e28;
  undefined8 local_e20;
  undefined8 uStack_e18;
  undefined8 uStack_e10;
  undefined8 uStack_e08;
  undefined8 local_e00;
  undefined8 uStack_df8;
  undefined8 uStack_df0;
  undefined8 uStack_de8;
  undefined8 local_de0;
  undefined8 uStack_dd8;
  undefined8 uStack_dd0;
  undefined8 uStack_dc8;
  undefined8 local_dc0;
  undefined8 uStack_db8;
  undefined8 uStack_db0;
  undefined8 uStack_da8;
  undefined8 local_da0;
  undefined8 uStack_d98;
  undefined8 uStack_d90;
  undefined8 uStack_d88;
  undefined8 local_d80;
  undefined8 uStack_d78;
  undefined8 local_d70;
  undefined8 uStack_d68;
  undefined8 local_d60;
  undefined8 uStack_d58;
  undefined8 local_d50;
  undefined8 uStack_d48;
  undefined4 local_d34;
  undefined8 local_d30;
  undefined8 uStack_d28;
  undefined4 local_d14;
  undefined8 local_d10;
  undefined8 uStack_d08;
  undefined4 local_cf4;
  undefined8 local_cf0;
  undefined8 uStack_ce8;
  undefined4 local_cd4;
  undefined8 local_cd0;
  undefined8 uStack_cc8;
  undefined8 local_cc0;
  undefined8 uStack_cb8;
  undefined8 uStack_cb0;
  undefined8 uStack_ca8;
  undefined8 local_ca0;
  undefined8 uStack_c98;
  undefined8 local_c90;
  undefined8 uStack_c88;
  undefined8 local_c80;
  undefined8 uStack_c78;
  undefined8 local_c70;
  undefined8 uStack_c68;
  undefined8 local_c60;
  undefined8 uStack_c58;
  undefined8 local_c50;
  undefined8 uStack_c48;
  undefined8 local_c40;
  undefined8 uStack_c38;
  undefined8 local_c30;
  undefined8 uStack_c28;
  undefined8 local_c20;
  undefined8 uStack_c18;
  undefined8 local_c10;
  undefined8 uStack_c08;
  undefined8 local_c00;
  undefined8 uStack_bf8;
  undefined8 local_bf0;
  undefined8 uStack_be8;
  undefined8 local_be0;
  undefined8 uStack_bd8;
  undefined8 local_bd0;
  undefined8 uStack_bc8;
  undefined8 local_bc0;
  undefined8 uStack_bb8;
  undefined8 local_bb0;
  undefined8 uStack_ba8;
  undefined8 local_ba0;
  ulong uStack_b98;
  undefined8 local_b90;
  undefined8 uStack_b88;
  undefined8 local_b80;
  ulong uStack_b78;
  undefined8 local_b70;
  undefined8 uStack_b68;
  undefined1 local_b60 [16];
  undefined1 local_b50 [16];
  undefined8 local_b40;
  undefined8 uStack_b38;
  undefined8 uStack_b30;
  undefined8 uStack_b28;
  undefined8 local_b20;
  undefined8 uStack_b18;
  undefined8 uStack_b10;
  undefined8 uStack_b08;
  undefined8 local_b00;
  undefined8 uStack_af8;
  undefined8 uStack_af0;
  undefined8 uStack_ae8;
  undefined8 local_ae0;
  undefined8 uStack_ad8;
  undefined8 uStack_ad0;
  undefined8 uStack_ac8;
  undefined8 local_ac0;
  undefined8 uStack_ab8;
  undefined8 uStack_ab0;
  undefined8 uStack_aa8;
  undefined8 local_aa0;
  undefined8 uStack_a98;
  undefined8 uStack_a90;
  undefined8 uStack_a88;
  undefined8 local_a80;
  undefined8 uStack_a78;
  undefined8 uStack_a70;
  undefined8 uStack_a68;
  undefined8 local_a60;
  undefined8 uStack_a58;
  undefined8 uStack_a50;
  undefined8 uStack_a48;
  undefined8 local_a40;
  undefined8 uStack_a38;
  undefined8 local_a30;
  undefined8 uStack_a28;
  undefined8 local_a20;
  undefined8 uStack_a18;
  undefined8 local_a10;
  undefined8 uStack_a08;
  undefined8 local_a00;
  undefined8 uStack_9f8;
  undefined8 uStack_9f0;
  undefined8 uStack_9e8;
  undefined1 local_9c0 [16];
  undefined1 auStack_9b0 [16];
  undefined4 local_990;
  undefined4 local_98c;
  undefined4 local_988;
  undefined4 local_984;
  undefined4 local_980;
  undefined4 local_97c;
  undefined4 local_978;
  undefined4 local_974;
  undefined1 local_970 [16];
  undefined1 local_960 [16];
  undefined1 local_950 [16];
  undefined8 local_940;
  undefined8 uStack_938;
  float local_930;
  float fStack_92c;
  float fStack_928;
  float fStack_924;
  undefined1 local_920 [16];
  undefined8 local_910;
  undefined8 uStack_908;
  undefined8 local_900;
  undefined8 uStack_8f8;
  undefined8 local_8f0;
  undefined8 uStack_8e8;
  undefined1 local_8e0 [16];
  undefined8 local_8d0;
  undefined8 uStack_8c8;
  undefined8 local_8c0;
  undefined8 uStack_8b8;
  undefined4 local_8b0;
  undefined4 uStack_8ac;
  undefined4 uStack_8a8;
  undefined4 uStack_8a4;
  undefined4 local_894;
  undefined1 local_890 [16];
  undefined1 local_880 [16];
  undefined1 local_870 [8];
  undefined8 uStack_868;
  float local_860;
  float fStack_85c;
  float fStack_858;
  float fStack_854;
  undefined8 local_850;
  undefined8 uStack_848;
  undefined8 local_840;
  undefined8 uStack_838;
  ulong local_830;
  ulong uStack_828;
  undefined1 local_820 [16];
  undefined1 local_810 [16];
  undefined1 local_800 [16];
  undefined1 local_7f0 [8];
  undefined8 uStack_7e8;
  ulong local_7e0;
  ulong uStack_7d8;
  undefined8 local_7d0;
  undefined8 uStack_7c8;
  undefined8 local_7c0;
  undefined8 uStack_7b8;
  undefined8 local_7b0;
  undefined8 uStack_7a8;
  float *local_7a0;
  undefined1 *local_798;
  undefined8 local_790;
  undefined8 uStack_788;
  undefined8 local_780;
  undefined8 uStack_778;
  undefined8 local_770;
  undefined8 uStack_768;
  ulong local_760;
  ulong uStack_758;
  undefined8 local_750;
  undefined8 uStack_748;
  undefined8 local_740;
  undefined8 uStack_738;
  undefined8 local_730;
  undefined8 uStack_728;
  undefined8 local_720;
  undefined8 uStack_718;
  undefined8 local_710;
  undefined8 uStack_708;
  undefined8 local_700;
  undefined8 uStack_6f8;
  undefined8 local_6f0;
  undefined8 uStack_6e8;
  undefined8 local_6e0;
  undefined8 uStack_6d8;
  undefined8 local_6d0;
  undefined8 uStack_6c8;
  undefined8 local_6c0;
  undefined8 uStack_6b8;
  undefined1 local_6b0 [16];
  undefined8 local_6a0;
  undefined8 uStack_698;
  undefined8 local_690;
  undefined8 uStack_688;
  undefined8 local_680;
  undefined8 uStack_678;
  undefined8 local_670;
  undefined8 uStack_668;
  undefined8 local_660;
  undefined8 uStack_658;
  undefined8 local_650;
  undefined8 uStack_648;
  undefined8 local_640;
  undefined8 uStack_638;
  undefined8 local_630;
  undefined8 uStack_628;
  undefined8 local_620;
  undefined8 uStack_618;
  undefined8 local_610;
  undefined8 uStack_608;
  undefined8 local_600;
  undefined8 uStack_5f8;
  undefined8 local_5f0;
  undefined8 uStack_5e8;
  undefined4 local_5d4;
  undefined8 local_5d0;
  undefined8 uStack_5c8;
  undefined4 local_5b4;
  undefined8 local_5b0;
  undefined8 uStack_5a8;
  undefined8 local_5a0;
  undefined8 uStack_598;
  undefined8 local_590;
  undefined8 uStack_588;
  undefined8 local_580;
  undefined8 uStack_578;
  undefined8 local_570;
  undefined8 uStack_568;
  undefined8 local_560;
  undefined8 uStack_558;
  undefined8 local_550;
  undefined8 uStack_548;
  undefined8 local_540;
  undefined8 uStack_538;
  undefined8 local_530;
  undefined8 uStack_528;
  undefined1 *local_518;
  float *local_510;
  float *local_508;
  float local_500;
  float fStack_4fc;
  float fStack_4f8;
  float fStack_4f4;
  undefined8 local_4f0;
  undefined8 uStack_4e8;
  float local_4e0 [2];
  float afStack_4d8 [2];
  undefined8 local_4d0;
  undefined8 uStack_4c8;
  undefined8 *local_4b8;
  undefined8 *local_4b0;
  undefined1 *local_4a8;
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined8 local_490;
  undefined8 uStack_488;
  undefined8 local_480;
  undefined8 uStack_478;
  float local_470;
  float fStack_46c;
  float fStack_468;
  float fStack_464;
  float *local_458;
  float *local_450;
  undefined1 *local_448;
  undefined8 local_440;
  undefined8 uStack_438;
  undefined8 local_430;
  undefined8 uStack_428;
  float local_420 [2];
  float afStack_418 [2];
  float local_410;
  float fStack_40c;
  float fStack_408;
  float fStack_404;
  float *local_3f8;
  float *local_3f0;
  undefined1 *local_3e8;
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined8 local_3d0;
  undefined8 uStack_3c8;
  float local_3c0 [2];
  float afStack_3b8 [2];
  float local_3b0;
  float fStack_3ac;
  float fStack_3a8;
  float fStack_3a4;
  float *local_398;
  float *local_390;
  undefined1 *local_388;
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 local_370;
  undefined8 uStack_368;
  float local_360 [2];
  float afStack_358 [2];
  float local_350;
  float fStack_34c;
  float fStack_348;
  float fStack_344;
  float *local_338;
  float *local_330;
  undefined1 *local_328;
  undefined8 local_320;
  undefined8 uStack_318;
  undefined8 local_310;
  undefined8 uStack_308;
  float local_300 [2];
  float afStack_2f8 [2];
  float local_2f0;
  float fStack_2ec;
  float fStack_2e8;
  float fStack_2e4;
  undefined8 *local_2d8;
  undefined8 *local_2d0;
  undefined1 *local_2c8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 local_2b0;
  undefined8 uStack_2a8;
  undefined8 local_2a0;
  undefined8 uStack_298;
  float local_290;
  float fStack_28c;
  float fStack_288;
  float fStack_284;
  undefined8 *local_278;
  undefined8 *local_270;
  undefined1 *local_268;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 local_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  float local_230;
  float fStack_22c;
  float fStack_228;
  float fStack_224;
  undefined8 *local_218;
  undefined8 *local_210;
  undefined1 *local_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 local_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  float local_1d0;
  float fStack_1cc;
  float fStack_1c8;
  float fStack_1c4;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 local_1b0;
  undefined8 uStack_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 local_190;
  undefined8 uStack_188;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 local_170;
  undefined8 uStack_168;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 local_150;
  undefined8 uStack_148;
  undefined8 local_140;
  ulong uStack_138;
  undefined8 local_130;
  undefined8 uStack_128;
  undefined1 local_120 [16];
  undefined8 local_110;
  undefined8 uStack_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  ulong local_f0;
  ulong uStack_e8;
  ulong local_e0;
  ulong uStack_d8;
  ulong local_d0;
  ulong uStack_c8;
  ulong local_c0;
  ulong uStack_b8;
  undefined8 local_b0;
  undefined8 uStack_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined8 local_90;
  undefined8 uStack_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 local_70;
  ulong uStack_68;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  undefined8 uStack_48;
  
  local_1d10 = *(int *)((long)in_RDI + 0x2c);
  local_1d14 = (int)in_RDI[6];
  local_1d18 = *(int *)((long)in_RDI + 0x34);
  local_1d1c = (int)in_RDI[7];
  local_1d20 = (int)in_RDI[3];
  local_1d24 = local_1d10 * local_1d14 * local_1d18 * local_1d20;
  local_1d00 = in_RDI;
  for (local_1d28 = 0; local_1d28 < local_1d1c; local_1d28 = local_1d28 + 1) {
    local_1ce8 = &local_1d78;
    local_1c3c = *(int *)((long)local_1d00 + 0x2c);
    local_1c40 = (int)local_1d00[6];
    local_1c44 = *(undefined4 *)((long)local_1d00 + 0x34);
    local_1c50 = (undefined1 (*) [32])
                 (*local_1d00 + local_1d00[8] * (long)local_1d28 * local_1d00[2]);
    local_1c58 = local_1d00[2];
    local_1c5c = (undefined4)local_1d00[3];
    local_1c68 = local_1d00[4];
    local_1c38 = &local_1d78;
    local_1c28 = (long)local_1c3c * (long)local_1c40 * local_1c58;
    local_1ce0 = &local_1d78;
    local_1cd0 = &local_1d78;
    local_1c2c = 0x10;
    local_1cf4 = local_1d28;
    local_1cf5 = 1;
    local_1d78 = 0;
    local_1d68 = 0;
    local_1d60 = 0;
    local_1d50 = 0;
    local_1d4c = 0;
    local_1d48 = 0;
    local_1d44 = 0;
    local_1d40 = 0;
    local_1d38 = 0;
    local_1d70 = 0;
    local_1d30 = local_1c50;
    for (local_1d7c = 0; local_1d7c + 7 < local_1d24; local_1d7c = local_1d7c + 8) {
      local_1cc8 = local_1d30;
      local_1b00 = *(undefined8 *)*local_1d30;
      uStack_1af8 = *(undefined8 *)(*local_1d30 + 8);
      uStack_1af0 = *(undefined8 *)(*local_1d30 + 0x10);
      uStack_1ae8 = *(undefined8 *)(*local_1d30 + 0x18);
      local_1be8 = local_1d09;
      local_1bf0 = &local_1da0;
      local_1a24 = 0x322bcc77;
      local_974 = 0x322bcc77;
      local_978 = 0x322bcc77;
      local_97c = 0x322bcc77;
      local_980 = 0x322bcc77;
      local_984 = 0x322bcc77;
      local_988 = 0x322bcc77;
      local_98c = 0x322bcc77;
      local_990 = 0x322bcc77;
      auVar3 = vinsertps_avx(ZEXT416(0x322bcc77),ZEXT416(0x322bcc77),0x10);
      auVar3 = vinsertps_avx(auVar3,ZEXT416(0x322bcc77),0x20);
      local_9c0 = vinsertps_avx(auVar3,ZEXT416(0x322bcc77),0x30);
      auVar3 = vinsertps_avx(ZEXT416(0x322bcc77),ZEXT416(0x322bcc77),0x10);
      auVar3 = vinsertps_avx(auVar3,ZEXT416(0x322bcc77),0x20);
      auStack_9b0 = vinsertps_avx(auVar3,ZEXT416(0x322bcc77),0x30);
      local_1b60 = local_9c0._0_8_;
      uStack_1b58 = local_9c0._8_8_;
      uStack_1b50 = auStack_9b0._0_8_;
      uStack_1b48 = auStack_9b0._8_8_;
      local_1728 = local_1b20;
      local_1730 = &local_1b40;
      local_1aa0 = ZEXT832(0) << 0x20;
      local_1720 = SUB168(*(undefined1 (*) [16])*local_1d30,0);
      uStack_1718 = SUB168(*(undefined1 (*) [16])*local_1d30,8);
      local_1600 = local_1720;
      uStack_15f8 = uStack_1718;
      local_1620 = 0x7fffffff7fffffff;
      uStack_1618 = 0x7fffffff7fffffff;
      uStack_1610 = 0x7fffffff7fffffff;
      uStack_1608 = 0x7fffffff7fffffff;
      auVar15._8_8_ = 0x7fffffff7fffffff;
      auVar15._0_8_ = 0x7fffffff7fffffff;
      auVar15._16_8_ = 0x7fffffff7fffffff;
      auVar15._24_8_ = 0x7fffffff7fffffff;
      auVar1 = vandps_avx(*local_1d30,auVar15);
      local_1640 = local_1720;
      uStack_1638 = uStack_1718;
      local_1660 = 0x8000000080000000;
      uStack_1658 = 0x8000000080000000;
      uStack_1650 = 0x8000000080000000;
      uStack_1648 = 0x8000000080000000;
      auVar14._8_8_ = 0x8000000080000000;
      auVar14._0_8_ = 0x8000000080000000;
      auVar14._16_8_ = 0x8000000080000000;
      auVar14._24_8_ = 0x8000000080000000;
      auVar2 = vandps_avx(*local_1d30,auVar14);
      local_1720 = auVar1._0_8_;
      uStack_1718 = auVar1._8_8_;
      uStack_1710 = auVar1._16_8_;
      uStack_1708 = auVar1._24_8_;
      local_1420 = local_1720;
      uVar56 = local_1420;
      uStack_1418 = uStack_1718;
      uVar57 = uStack_1418;
      uStack_1410 = uStack_1710;
      uVar58 = uStack_1410;
      uStack_1408 = uStack_1708;
      uVar59 = uStack_1408;
      local_1440 = 0x3fa2f9833fa2f983;
      uStack_1438 = 0x3fa2f9833fa2f983;
      uStack_1430 = 0x3fa2f9833fa2f983;
      uStack_1428 = 0x3fa2f9833fa2f983;
      local_1420._0_4_ = auVar1._0_4_;
      local_1420._4_4_ = auVar1._4_4_;
      uStack_1418._0_4_ = auVar1._8_4_;
      uStack_1418._4_4_ = auVar1._12_4_;
      uStack_1410._0_4_ = auVar1._16_4_;
      uStack_1410._4_4_ = auVar1._20_4_;
      uStack_1408._0_4_ = auVar1._24_4_;
      uStack_1408._4_4_ = auVar1._28_4_;
      local_17e0._4_4_ = local_1420._4_4_ * 1.2732395;
      local_17e0._0_4_ = (float)local_1420 * 1.2732395;
      uStack_17d8._0_4_ = (float)uStack_1418 * 1.2732395;
      uStack_17d8._4_4_ = uStack_1418._4_4_ * 1.2732395;
      uStack_17d0._0_4_ = (float)uStack_1410 * 1.2732395;
      uStack_17d0._4_4_ = uStack_1410._4_4_ * 1.2732395;
      auVar53 = _local_17e0;
      uStack_17c8._0_4_ = (float)uStack_1408 * 1.2732395;
      uStack_17c8._4_4_ = uStack_1408._4_4_;
      auVar1 = _local_17e0;
      uStack_17d0 = auVar53._16_8_;
      uStack_17c8 = auVar1._24_8_;
      local_da0 = local_17e0;
      uStack_d98 = uStack_17d8;
      uStack_d90 = uStack_17d0;
      uStack_d88 = uStack_17c8;
      local_18c0 = (int)((float)local_1420 * 1.2732395);
      iStack_18bc = (int)(local_1420._4_4_ * 1.2732395);
      iStack_18b8 = (int)((float)uStack_1418 * 1.2732395);
      iStack_18b4 = (int)(uStack_1418._4_4_ * 1.2732395);
      iStack_18b0 = (int)((float)uStack_1410 * 1.2732395);
      iStack_18ac = (int)(uStack_1410._4_4_ * 1.2732395);
      iStack_18a8 = (int)((float)uStack_1408 * 1.2732395);
      iStack_18a4 = (int)uStack_1408._4_4_;
      local_d50 = CONCAT44(iStack_18bc,local_18c0);
      uStack_d48 = CONCAT44(iStack_18b4,iStack_18b8);
      local_d70 = CONCAT44(iStack_18ac,iStack_18b0);
      uStack_d68 = CONCAT44(iStack_18a4,iStack_18a8);
      local_d60 = 0x100000001;
      uStack_d58 = 0x100000001;
      auVar6._8_8_ = uStack_d48;
      auVar6._0_8_ = local_d50;
      auVar3._8_8_ = 0x100000001;
      auVar3._0_8_ = 0x100000001;
      auVar3 = vpaddd_avx(auVar6,auVar3);
      local_d80 = 0x100000001;
      uStack_d78 = 0x100000001;
      auVar5._8_8_ = uStack_d68;
      auVar5._0_8_ = local_d70;
      auVar4._8_8_ = 0x100000001;
      auVar4._0_8_ = 0x100000001;
      auVar4 = vpaddd_avx(auVar5,auVar4);
      local_1870._0_8_ = auVar3._0_8_;
      local_1870._8_8_ = auVar3._8_8_;
      local_bb0 = local_1870._0_8_;
      uStack_ba8 = local_1870._8_8_;
      local_bc0 = 0xfffffffefffffffe;
      uStack_bb8 = 0xfffffffefffffffe;
      auVar27._8_8_ = 0xfffffffefffffffe;
      auVar27._0_8_ = 0xfffffffefffffffe;
      auVar3 = vpand_avx(auVar3,auVar27);
      local_1880._0_8_ = auVar4._0_8_;
      local_1880._8_8_ = auVar4._8_8_;
      local_bd0 = local_1880._0_8_;
      uStack_bc8 = local_1880._8_8_;
      local_be0 = 0xfffffffefffffffe;
      uStack_bd8 = 0xfffffffefffffffe;
      auVar26._8_8_ = 0xfffffffefffffffe;
      auVar26._0_8_ = 0xfffffffefffffffe;
      auVar4 = vpand_avx(auVar4,auVar26);
      local_1870._0_8_ = auVar3._0_8_;
      local_c70 = local_1870._0_8_;
      local_1870._8_8_ = auVar3._8_8_;
      uStack_c68 = local_1870._8_8_;
      local_18e0 = local_1870._0_8_;
      uStack_18d8 = local_1870._8_8_;
      local_1880._0_8_ = auVar4._0_8_;
      local_c90 = local_1880._0_8_;
      local_1880._8_8_ = auVar4._8_8_;
      uStack_c88 = local_1880._8_8_;
      uStack_18d0 = local_1880._0_8_;
      uStack_18c8 = local_1880._8_8_;
      local_cc0 = local_1870._0_8_;
      uStack_cb8 = local_1870._8_8_;
      uStack_cb0 = local_1880._0_8_;
      uStack_ca8 = local_1880._8_8_;
      auVar19._16_8_ = local_1880._0_8_;
      auVar19._0_16_ = auVar3;
      auVar19._24_8_ = local_1880._8_8_;
      auVar1 = vcvtdq2ps_avx(auVar19);
      local_bf0 = local_1870._0_8_;
      uStack_be8 = local_1870._8_8_;
      local_c00 = 0x400000004;
      uStack_bf8 = 0x400000004;
      auVar25._8_8_ = 0x400000004;
      auVar25._0_8_ = 0x400000004;
      auVar5 = vpand_avx(auVar3,auVar25);
      local_c10 = local_1880._0_8_;
      uStack_c08 = local_1880._8_8_;
      local_c20 = 0x400000004;
      uStack_c18 = 0x400000004;
      auVar24._8_8_ = 0x400000004;
      auVar24._0_8_ = 0x400000004;
      auVar6 = vpand_avx(auVar4,auVar24);
      local_1850._0_8_ = auVar5._0_8_;
      local_1850._8_8_ = auVar5._8_8_;
      local_cd0 = local_1850._0_8_;
      uStack_cc8 = local_1850._8_8_;
      local_cd4 = 0x1d;
      local_1850 = vpslld_avx(auVar5,ZEXT416(0x1d));
      local_1860._0_8_ = auVar6._0_8_;
      local_1860._8_8_ = auVar6._8_8_;
      local_cf0 = local_1860._0_8_;
      uStack_ce8 = local_1860._8_8_;
      local_cf4 = 0x1d;
      local_1860 = vpslld_avx(auVar6,ZEXT416(0x1d));
      local_1900 = local_1850._0_8_;
      uStack_18f8 = local_1850._8_8_;
      uStack_18f0 = local_1860._0_8_;
      uStack_18e8 = local_1860._8_8_;
      local_1800 = local_1850._0_8_;
      uStack_17f8 = local_1850._8_8_;
      uStack_17f0 = local_1860._0_8_;
      uStack_17e8 = local_1860._8_8_;
      local_c30 = local_1870._0_8_;
      uStack_c28 = local_1870._8_8_;
      local_c40 = 0x200000002;
      uStack_c38 = 0x200000002;
      auVar23._8_8_ = 0x200000002;
      auVar23._0_8_ = 0x200000002;
      auVar5 = vpand_avx(auVar3,auVar23);
      local_c50 = local_1880._0_8_;
      uStack_c48 = local_1880._8_8_;
      local_c60 = 0x200000002;
      uStack_c58 = 0x200000002;
      auVar22._8_8_ = 0x200000002;
      auVar22._0_8_ = 0x200000002;
      auVar6 = vpand_avx(auVar4,auVar22);
      local_1870._0_8_ = auVar5._0_8_;
      local_1870._8_8_ = auVar5._8_8_;
      local_b60 = ZEXT816(0) << 0x20;
      local_b50._8_8_ = SUB168(ZEXT816(0),4);
      local_b70 = local_1870._0_8_;
      uStack_b68 = local_1870._8_8_;
      local_b80 = 0;
      uStack_b78 = local_b50._8_8_;
      auVar49._8_8_ = 0;
      auVar49._0_8_ = local_b50._8_8_;
      local_1870 = vpcmpeqd_avx(auVar5,auVar49 << 0x40);
      local_1880._0_8_ = auVar6._0_8_;
      local_1880._8_8_ = auVar6._8_8_;
      local_b90 = local_1880._0_8_;
      uStack_b88 = local_1880._8_8_;
      local_ba0 = 0;
      uStack_b98 = local_b50._8_8_;
      auVar50._8_8_ = 0;
      auVar50._0_8_ = local_b50._8_8_;
      local_1880 = vpcmpeqd_avx(auVar6,auVar50 << 0x40);
      local_1920 = local_1870._0_8_;
      uStack_1918 = local_1870._8_8_;
      uStack_1910 = local_1880._0_8_;
      uStack_1908 = local_1880._8_8_;
      local_1820 = local_1870._0_8_;
      uStack_1818 = local_1870._8_8_;
      uStack_1810 = local_1880._0_8_;
      uStack_1808 = local_1880._8_8_;
      local_16c0 = local_1850._0_8_;
      uStack_16b8 = local_1850._8_8_;
      uStack_16b0 = local_1860._0_8_;
      uStack_16a8 = local_1860._8_8_;
      local_1940 = local_1850._0_8_;
      uStack_1938 = local_1850._8_8_;
      uStack_1930 = local_1860._0_8_;
      uStack_1928 = local_1860._8_8_;
      local_16e0 = local_1870._0_8_;
      uStack_16d8 = local_1870._8_8_;
      uStack_16d0 = local_1880._0_8_;
      uStack_16c8 = local_1880._8_8_;
      local_1960 = local_1870._0_8_;
      uStack_1958 = local_1870._8_8_;
      uStack_1950 = local_1880._0_8_;
      uStack_1948 = local_1880._8_8_;
      local_12c8 = local_17e0;
      local_1150 = &local_1760;
      local_13f8 = &local_1720;
      local_17e0 = auVar1._0_8_;
      uVar8 = local_17e0;
      uStack_17d8 = auVar1._8_8_;
      uVar9 = uStack_17d8;
      uStack_17d0 = auVar1._16_8_;
      uVar10 = uStack_17d0;
      uStack_17c8 = auVar1._24_8_;
      uVar11 = uStack_17c8;
      local_1140 = 0xbf490000bf490000;
      uStack_1138 = 0xbf490000bf490000;
      uStack_1130 = 0xbf490000bf490000;
      uStack_1128 = 0xbf490000bf490000;
      local_1120._0_4_ = auVar1._0_4_;
      local_1120._4_4_ = auVar1._4_4_;
      uStack_1118._0_4_ = auVar1._8_4_;
      uStack_1118._4_4_ = auVar1._12_4_;
      uStack_1110._0_4_ = auVar1._16_4_;
      uStack_1110._4_4_ = auVar1._20_4_;
      uStack_1108._0_4_ = auVar1._24_4_;
      local_1040 = (float)local_1120 * -0.78515625;
      fStack_103c = local_1120._4_4_ * -0.78515625;
      fStack_1038 = (float)uStack_1118 * -0.78515625;
      fStack_1034 = uStack_1118._4_4_ * -0.78515625;
      fStack_1030 = (float)uStack_1110 * -0.78515625;
      fStack_102c = uStack_1110._4_4_ * -0.78515625;
      fStack_1028 = (float)uStack_1108 * -0.78515625;
      local_1060 = local_1720;
      uStack_1058 = uStack_1718;
      uStack_1050 = uStack_1710;
      uStack_1048 = uStack_1708;
      uStack_1024 = 0xbf490000;
      local_1720 = CONCAT44(fStack_103c + local_1420._4_4_,local_1040 + (float)local_1420);
      uStack_1718._0_4_ = fStack_1038 + (float)uStack_1418;
      uStack_1718._4_4_ = fStack_1034 + uStack_1418._4_4_;
      uStack_1710._0_4_ = fStack_1030 + (float)uStack_1410;
      uStack_1710._4_4_ = fStack_102c + uStack_1410._4_4_;
      auVar53 = _local_1720;
      uStack_1708._0_4_ = fStack_1028 + (float)uStack_1408;
      uStack_1708._4_4_ = uStack_1408._4_4_ + -0.78515625;
      auVar1 = _local_1720;
      local_11b0 = &local_1780;
      local_1180 = local_17e0;
      uStack_1178 = uStack_17d8;
      uStack_1170 = uStack_17d0;
      uStack_1168 = uStack_17c8;
      local_11a0 = 0xb97da000b97da000;
      uStack_1198 = 0xb97da000b97da000;
      uStack_1190 = 0xb97da000b97da000;
      uStack_1188 = 0xb97da000b97da000;
      local_1000 = (float)local_1120 * -0.00024187565;
      fStack_ffc = local_1120._4_4_ * -0.00024187565;
      fStack_ff8 = (float)uStack_1118 * -0.00024187565;
      fStack_ff4 = uStack_1118._4_4_ * -0.00024187565;
      fStack_ff0 = (float)uStack_1110 * -0.00024187565;
      fStack_fec = uStack_1110._4_4_ * -0.00024187565;
      fStack_fe8 = (float)uStack_1108 * -0.00024187565;
      local_1020 = local_1720;
      uStack_1018 = uStack_1718;
      uStack_1710 = auVar53._16_8_;
      uStack_1010 = uStack_1710;
      uStack_1708 = auVar1._24_8_;
      uStack_1008 = uStack_1708;
      uStack_fe4 = 0xb97da000;
      fVar94 = local_1000 + local_1040 + (float)local_1420;
      fVar95 = fStack_ffc + fStack_103c + local_1420._4_4_;
      fVar96 = fStack_ff8 + fStack_1038 + (float)uStack_1418;
      fVar97 = fStack_ff4 + fStack_1034 + uStack_1418._4_4_;
      fVar98 = fStack_ff0 + fStack_1030 + (float)uStack_1410;
      fVar99 = fStack_fec + fStack_102c + uStack_1410._4_4_;
      fVar100 = fStack_fe8 + fStack_1028 + (float)uStack_1408;
      fStack_19a4 = uStack_1408._4_4_ + -0.78515625 + -0.00024187565;
      local_1720 = CONCAT44(fVar95,fVar94);
      uStack_1718._0_4_ = fVar96;
      uStack_1718._4_4_ = fVar97;
      uStack_1710._0_4_ = fVar98;
      uStack_1710._4_4_ = fVar99;
      auVar53 = _local_1720;
      uStack_1708._0_4_ = fVar100;
      uStack_1708._4_4_ = fStack_19a4;
      auVar1 = _local_1720;
      local_1210 = &local_17a0;
      local_11e0 = local_17e0;
      uStack_11d8 = uStack_17d8;
      uStack_11d0 = uStack_17d0;
      uStack_11c8 = uStack_17c8;
      local_1200 = 0xb3222169b3222169;
      uStack_11f8 = 0xb3222169b3222169;
      uStack_11f0 = 0xb3222169b3222169;
      uStack_11e8 = 0xb3222169b3222169;
      local_fc0 = (float)local_1120 * -3.774895e-08;
      fStack_fbc = local_1120._4_4_ * -3.774895e-08;
      fStack_fb8 = (float)uStack_1118 * -3.774895e-08;
      fStack_fb4 = uStack_1118._4_4_ * -3.774895e-08;
      fStack_fb0 = (float)uStack_1110 * -3.774895e-08;
      fStack_fac = uStack_1110._4_4_ * -3.774895e-08;
      fStack_fa8 = (float)uStack_1108 * -3.774895e-08;
      local_fe0 = local_1720;
      uStack_fd8 = uStack_1718;
      uStack_1710 = auVar53._16_8_;
      uStack_fd0 = uStack_1710;
      uStack_1708 = auVar1._24_8_;
      uStack_fc8 = uStack_1708;
      uStack_fa4 = 0xb3222169;
      fVar94 = local_fc0 + fVar94;
      fVar95 = fStack_fbc + fVar95;
      fVar96 = fStack_fb8 + fVar96;
      fVar97 = fStack_fb4 + fVar97;
      fVar98 = fStack_fb0 + fVar98;
      fVar99 = fStack_fac + fVar99;
      fVar100 = fStack_fa8 + fVar100;
      fStack_19a4 = fStack_19a4 + -3.774895e-08;
      local_1720 = CONCAT44(fVar95,fVar94);
      uStack_1718._0_4_ = fVar96;
      uStack_1718._4_4_ = fVar97;
      uStack_1710._0_4_ = fVar98;
      uStack_1710._4_4_ = fVar99;
      auVar53 = _local_1720;
      uStack_1708._0_4_ = fVar100;
      uStack_1708._4_4_ = fStack_19a4;
      auVar15 = _local_1720;
      local_c80 = 0x200000002;
      uStack_c78 = 0x200000002;
      auVar21._8_8_ = 0x200000002;
      auVar21._0_8_ = 0x200000002;
      auVar3 = vpsubd_avx(auVar3,auVar21);
      local_ca0 = 0x200000002;
      uStack_c98 = 0x200000002;
      auVar20._8_8_ = 0x200000002;
      auVar20._0_8_ = 0x200000002;
      auVar4 = vpsubd_avx(auVar4,auVar20);
      local_1890._0_8_ = auVar3._0_8_;
      local_1890._8_8_ = auVar3._8_8_;
      local_a10 = local_1890._0_8_;
      uStack_a08 = local_1890._8_8_;
      local_a20 = 0x400000004;
      uStack_a18 = 0x400000004;
      auVar31._8_8_ = 0x400000004;
      auVar31._0_8_ = 0x400000004;
      auVar3 = vpandn_avx(auVar3,auVar31);
      local_18a0._0_8_ = auVar4._0_8_;
      local_18a0._8_8_ = auVar4._8_8_;
      local_a30 = local_18a0._0_8_;
      uStack_a28 = local_18a0._8_8_;
      local_a40 = 0x400000004;
      uStack_a38 = 0x400000004;
      auVar30._8_8_ = 0x400000004;
      auVar30._0_8_ = 0x400000004;
      auVar4 = vpandn_avx(auVar4,auVar30);
      local_1890._0_8_ = auVar3._0_8_;
      local_1890._8_8_ = auVar3._8_8_;
      local_d10 = local_1890._0_8_;
      uStack_d08 = local_1890._8_8_;
      local_d14 = 0x1d;
      local_1890 = vpslld_avx(auVar3,ZEXT416(0x1d));
      local_18a0._0_8_ = auVar4._0_8_;
      local_18a0._8_8_ = auVar4._8_8_;
      local_d30 = local_18a0._0_8_;
      uStack_d28 = local_18a0._8_8_;
      local_d34 = 0x1d;
      local_18a0 = vpslld_avx(auVar4,ZEXT416(0x1d));
      local_1980 = local_1890._0_8_;
      uStack_1978 = local_1890._8_8_;
      uStack_1970 = local_18a0._0_8_;
      uStack_1968 = local_18a0._8_8_;
      local_1840 = local_1890._0_8_;
      uStack_1838 = local_1890._8_8_;
      uStack_1830 = local_18a0._0_8_;
      uStack_1828 = local_18a0._8_8_;
      local_1700 = local_1890._0_8_;
      uStack_16f8 = local_1890._8_8_;
      uStack_16f0 = local_18a0._0_8_;
      uStack_16e8 = local_18a0._8_8_;
      local_19a0 = local_1890._0_8_;
      uStack_1998 = local_1890._8_8_;
      uStack_1990 = local_18a0._0_8_;
      uStack_1988 = local_18a0._8_8_;
      local_17c0 = auVar2._0_8_;
      uStack_17b8 = auVar2._8_8_;
      uStack_17b0 = auVar2._16_8_;
      uStack_17a8 = auVar2._24_8_;
      local_aa0 = local_17c0;
      uVar84 = local_aa0;
      uStack_a98 = uStack_17b8;
      uVar85 = uStack_a98;
      uStack_a90 = uStack_17b0;
      uVar86 = uStack_a90;
      uStack_a88 = uStack_17a8;
      uVar87 = uStack_a88;
      local_ac0 = local_1850._0_8_;
      uVar80 = local_ac0;
      uStack_ab8 = local_1850._8_8_;
      uVar81 = uStack_ab8;
      uStack_ab0 = local_1860._0_8_;
      uVar82 = uStack_ab0;
      uStack_aa8 = local_1860._8_8_;
      uVar83 = uStack_aa8;
      local_aa0._0_4_ = auVar2._0_4_;
      local_aa0._4_4_ = auVar2._4_4_;
      uStack_a98._0_4_ = auVar2._8_4_;
      uStack_a98._4_4_ = auVar2._12_4_;
      uStack_a90._0_4_ = auVar2._16_4_;
      uStack_a90._4_4_ = auVar2._20_4_;
      uStack_a88._0_4_ = auVar2._24_4_;
      uStack_a88._4_4_ = auVar2._28_4_;
      local_ac0._0_4_ = local_1850._0_4_;
      local_ac0._4_4_ = local_1850._4_4_;
      uStack_ab8._0_4_ = local_1850._8_4_;
      uStack_ab8._4_4_ = local_1850._12_4_;
      uStack_ab0._0_4_ = local_1860._0_4_;
      uStack_ab0._4_4_ = local_1860._4_4_;
      uStack_aa8._0_4_ = local_1860._8_4_;
      uStack_aa8._4_4_ = local_1860._12_4_;
      local_17c0 = CONCAT44(local_aa0._4_4_ ^ local_ac0._4_4_,(uint)local_aa0 ^ (uint)local_ac0);
      uStack_17b8._0_4_ = (uint)uStack_a98 ^ (uint)uStack_ab8;
      uStack_17b8._4_4_ = uStack_a98._4_4_ ^ uStack_ab8._4_4_;
      uStack_17b0._0_4_ = (uint)uStack_a90 ^ (uint)uStack_ab0;
      uStack_17b0._4_4_ = uStack_a90._4_4_ ^ uStack_ab0._4_4_;
      auVar55 = _local_17c0;
      uStack_17a8._0_4_ = (uint)uStack_a88 ^ (uint)uStack_aa8;
      uStack_17a8._4_4_ = uStack_a88._4_4_ ^ uStack_aa8._4_4_;
      auVar14 = _local_17c0;
      uStack_1710 = auVar53._16_8_;
      uStack_1708 = auVar15._24_8_;
      local_1460 = local_1720;
      uStack_1458 = uStack_1718;
      uStack_1450 = uStack_1710;
      uStack_1448 = uStack_1708;
      local_1480 = local_1720;
      uStack_1478 = uStack_1718;
      uStack_1470 = uStack_1710;
      uStack_1468 = uStack_1708;
      local_19c0 = fVar94 * fVar94;
      fStack_19bc = fVar95 * fVar95;
      fStack_19b8 = fVar96 * fVar96;
      fStack_19b4 = fVar97 * fVar97;
      fStack_19b0 = fVar98 * fVar98;
      fStack_19ac = fVar99 * fVar99;
      fStack_19a8 = fVar100 * fVar100;
      local_1390 = &local_19c0;
      local_1278 = _ps256_coscof_p1;
      local_1240 = 0x37ccf5ce37ccf5ce;
      uStack_1238 = 0x37ccf5ce37ccf5ce;
      uStack_1230 = 0x37ccf5ce37ccf5ce;
      uStack_1228 = 0x37ccf5ce37ccf5ce;
      local_1260 = CONCAT44(fStack_19bc,local_19c0);
      uStack_1258 = CONCAT44(fStack_19b4,fStack_19b8);
      uStack_1250 = CONCAT44(fStack_19ac,fStack_19b0);
      uStack_1248 = CONCAT44(fStack_19a4,fStack_19a8);
      local_f80 = local_19c0 * 2.4433157e-05;
      fStack_f7c = fStack_19bc * 2.4433157e-05;
      fStack_f78 = fStack_19b8 * 2.4433157e-05;
      fStack_f74 = fStack_19b4 * 2.4433157e-05;
      fStack_f70 = fStack_19b0 * 2.4433157e-05;
      fStack_f6c = fStack_19ac * 2.4433157e-05;
      fStack_f68 = fStack_19a8 * 2.4433157e-05;
      local_fa0[0] = -0.0013887316;
      local_fa0[1] = -0.0013887316;
      afStack_f98[0] = -0.0013887316;
      afStack_f98[1] = -0.0013887316;
      afStack_f90[0] = -0.0013887316;
      afStack_f90[1] = -0.0013887316;
      afStack_f88[0] = -0.0013887316;
      afStack_f88[1] = -0.0013887316;
      local_17e0._4_4_ = fStack_f7c + -0.0013887316;
      local_17e0._0_4_ = local_f80 + -0.0013887316;
      uStack_17d8._0_4_ = fStack_f78 + -0.0013887316;
      uStack_17d8._4_4_ = fStack_f74 + -0.0013887316;
      uStack_17d0._0_4_ = fStack_f70 + -0.0013887316;
      uStack_17d0._4_4_ = fStack_f6c + -0.0013887316;
      auVar53 = _local_17e0;
      uStack_17c8._0_4_ = fStack_f68 + -0.0013887316;
      uStack_17c8._4_4_ = fStack_19a4 + -0.0013887316;
      auVar1 = _local_17e0;
      local_12d8 = _ps256_coscof_p2;
      local_12a0 = local_17e0;
      uStack_1298 = uStack_17d8;
      uStack_17d0 = auVar53._16_8_;
      uStack_1290 = uStack_17d0;
      uStack_17c8 = auVar1._24_8_;
      uStack_1288 = uStack_17c8;
      local_12c0 = CONCAT44(fStack_19bc,local_19c0);
      uStack_12b8 = CONCAT44(fStack_19b4,fStack_19b8);
      uStack_12b0 = CONCAT44(fStack_19ac,fStack_19b0);
      uStack_12a8 = CONCAT44(fStack_19a4,fStack_19a8);
      local_f40 = (local_f80 + -0.0013887316) * local_19c0;
      fStack_f3c = (fStack_f7c + -0.0013887316) * fStack_19bc;
      fStack_f38 = (fStack_f78 + -0.0013887316) * fStack_19b8;
      fStack_f34 = (fStack_f74 + -0.0013887316) * fStack_19b4;
      fStack_f30 = (fStack_f70 + -0.0013887316) * fStack_19b0;
      fStack_f2c = (fStack_f6c + -0.0013887316) * fStack_19ac;
      fStack_f28 = (fStack_f68 + -0.0013887316) * fStack_19a8;
      local_f60[0] = 0.041666646;
      local_f60[1] = 0.041666646;
      afStack_f58[0] = 0.041666646;
      afStack_f58[1] = 0.041666646;
      afStack_f50[0] = 0.041666646;
      afStack_f50[1] = 0.041666646;
      afStack_f48[0] = 0.041666646;
      afStack_f48[1] = 0.041666646;
      fVar93 = fStack_19a4 + 0.041666646;
      local_17e0._4_4_ = fStack_f3c + 0.041666646;
      local_17e0._0_4_ = local_f40 + 0.041666646;
      uStack_17d8._0_4_ = fStack_f38 + 0.041666646;
      uStack_17d8._4_4_ = fStack_f34 + 0.041666646;
      uStack_17d0._0_4_ = fStack_f30 + 0.041666646;
      uStack_17d0._4_4_ = fStack_f2c + 0.041666646;
      auVar53 = _local_17e0;
      uStack_17c8._0_4_ = fStack_f28 + 0.041666646;
      uStack_17c8._4_4_ = fVar93;
      auVar1 = _local_17e0;
      uStack_17d0 = auVar53._16_8_;
      uStack_17c8 = auVar1._24_8_;
      local_14c0 = CONCAT44(fStack_19bc,local_19c0);
      uStack_14b8 = CONCAT44(fStack_19b4,fStack_19b8);
      uStack_14b0 = CONCAT44(fStack_19ac,fStack_19b0);
      uStack_14a8 = CONCAT44(fStack_19a4,fStack_19a8);
      local_14a0 = local_17e0;
      uStack_1498 = uStack_17d8;
      uStack_1490 = uStack_17d0;
      uStack_1488 = uStack_17c8;
      local_17e0._0_4_ = (local_f40 + 0.041666646) * local_19c0;
      local_17e0._4_4_ = (fStack_f3c + 0.041666646) * fStack_19bc;
      fVar88 = (fStack_f38 + 0.041666646) * fStack_19b8;
      fVar89 = (fStack_f34 + 0.041666646) * fStack_19b4;
      fVar90 = (fStack_f30 + 0.041666646) * fStack_19b0;
      fVar91 = (fStack_f2c + 0.041666646) * fStack_19ac;
      fVar92 = (fStack_f28 + 0.041666646) * fStack_19a8;
      uStack_17d8._0_4_ = fVar88;
      uStack_17d8._4_4_ = fVar89;
      uStack_17d0._0_4_ = fVar90;
      uStack_17d0._4_4_ = fVar91;
      auVar53 = _local_17e0;
      uStack_17c8._0_4_ = fVar92;
      auVar1 = _local_17e0;
      uStack_17d0 = auVar53._16_8_;
      uStack_17c8 = auVar1._24_8_;
      local_1500 = CONCAT44(fStack_19bc,local_19c0);
      uStack_14f8 = CONCAT44(fStack_19b4,fStack_19b8);
      uStack_14f0 = CONCAT44(fStack_19ac,fStack_19b0);
      uStack_14e8 = CONCAT44(fStack_19a4,fStack_19a8);
      local_14e0 = local_17e0;
      uStack_14d8 = uStack_17d8;
      uStack_14d0 = uStack_17d0;
      uStack_14c8 = uStack_17c8;
      local_17e0._4_4_ = (float)local_17e0._4_4_ * fStack_19bc;
      local_17e0._0_4_ = (float)local_17e0._0_4_ * local_19c0;
      uStack_17d8._0_4_ = fVar88 * fStack_19b8;
      uStack_17d8._4_4_ = fVar89 * fStack_19b4;
      uStack_17d0._0_4_ = fVar90 * fStack_19b0;
      uStack_17d0._4_4_ = fVar91 * fStack_19ac;
      auVar53 = _local_17e0;
      uStack_17c8._0_4_ = fVar92 * fStack_19a8;
      auVar1 = _local_17e0;
      local_10f0 = ::_ps256_0p5;
      local_10c0 = local_17e0;
      uStack_10b8 = uStack_17d8;
      uStack_17d0 = auVar53._16_8_;
      uStack_10b0 = uStack_17d0;
      uStack_17c8 = auVar1._24_8_;
      uStack_10a8 = uStack_17c8;
      local_1080 = CONCAT44(fStack_19bc,local_19c0);
      uStack_1078 = CONCAT44(fStack_19b4,fStack_19b8);
      uStack_1070 = CONCAT44(fStack_19ac,fStack_19b0);
      uStack_1068 = CONCAT44(fStack_19a4,fStack_19a8);
      local_10a0[0] = 0.5;
      local_10a0[1] = 0.5;
      afStack_1098[0] = 0.5;
      afStack_1098[1] = 0.5;
      afStack_1090[0] = 0.5;
      afStack_1090[1] = 0.5;
      afStack_1088[0] = 0.5;
      afStack_1088[1] = 0.5;
      local_10e0 = local_19c0 * 0.5;
      fStack_10dc = fStack_19bc * 0.5;
      fStack_10d8 = fStack_19b8 * 0.5;
      fStack_10d4 = fStack_19b4 * 0.5;
      fStack_10d0 = fStack_19b0 * 0.5;
      fStack_10cc = fStack_19ac * 0.5;
      fStack_10c8 = fStack_19a8 * 0.5;
      auVar18._4_4_ = fStack_10dc;
      auVar18._0_4_ = local_10e0;
      auVar18._8_4_ = fStack_10d8;
      auVar18._12_4_ = fStack_10d4;
      auVar18._16_4_ = fStack_10d0;
      auVar18._20_4_ = fStack_10cc;
      auVar18._24_4_ = fStack_10c8;
      auVar18._28_4_ = fStack_19a4;
      auVar1 = vsubps_avx(auVar1,auVar18);
      local_17e0 = auVar1._0_8_;
      uStack_17d8 = auVar1._8_8_;
      uStack_17d0 = auVar1._16_8_;
      uStack_17c8 = auVar1._24_8_;
      local_dc0 = local_17e0;
      uVar76 = local_dc0;
      uStack_db8 = uStack_17d8;
      uVar77 = uStack_db8;
      uStack_db0 = uStack_17d0;
      uVar78 = uStack_db0;
      uStack_da8 = uStack_17c8;
      uVar79 = uStack_da8;
      local_de0 = 0x3f8000003f800000;
      uStack_dd8 = 0x3f8000003f800000;
      uStack_dd0 = 0x3f8000003f800000;
      uStack_dc8 = 0x3f8000003f800000;
      local_dc0._0_4_ = auVar1._0_4_;
      local_dc0._4_4_ = auVar1._4_4_;
      uStack_db8._0_4_ = auVar1._8_4_;
      uStack_db8._4_4_ = auVar1._12_4_;
      uStack_db0._0_4_ = auVar1._16_4_;
      uStack_db0._4_4_ = auVar1._20_4_;
      uStack_da8._0_4_ = auVar1._24_4_;
      uStack_da8._4_4_ = auVar1._28_4_;
      local_17e0._4_4_ = local_dc0._4_4_ + 1.0;
      local_17e0._0_4_ = (float)local_dc0 + 1.0;
      uStack_17d8._0_4_ = (float)uStack_db8 + 1.0;
      uStack_17d8._4_4_ = uStack_db8._4_4_ + 1.0;
      uStack_17d0._0_4_ = (float)uStack_db0 + 1.0;
      uStack_17d0._4_4_ = uStack_db0._4_4_ + 1.0;
      auVar54 = _local_17e0;
      uStack_17c8._0_4_ = (float)uStack_da8 + 1.0;
      uStack_17c8._4_4_ = uStack_da8._4_4_ + 1.0;
      auVar2 = _local_17e0;
      local_13e8 = local_19e0;
      local_1338 = _ps256_sincof_p1;
      local_1300 = 0xb94ca1f9b94ca1f9;
      uStack_12f8 = 0xb94ca1f9b94ca1f9;
      uStack_12f0 = 0xb94ca1f9b94ca1f9;
      uStack_12e8 = 0xb94ca1f9b94ca1f9;
      local_1320 = CONCAT44(fStack_19bc,local_19c0);
      uStack_1318 = CONCAT44(fStack_19b4,fStack_19b8);
      uStack_1310 = CONCAT44(fStack_19ac,fStack_19b0);
      uStack_1308 = CONCAT44(fStack_19a4,fStack_19a8);
      local_f00 = local_19c0 * -0.00019515296;
      fStack_efc = fStack_19bc * -0.00019515296;
      fStack_ef8 = fStack_19b8 * -0.00019515296;
      fStack_ef4 = fStack_19b4 * -0.00019515296;
      fStack_ef0 = fStack_19b0 * -0.00019515296;
      fStack_eec = fStack_19ac * -0.00019515296;
      fStack_ee8 = fStack_19a8 * -0.00019515296;
      local_f20[0] = 0.008332161;
      local_f20[1] = 0.008332161;
      afStack_f18[0] = 0.008332161;
      afStack_f18[1] = 0.008332161;
      afStack_f10[0] = 0.008332161;
      afStack_f10[1] = 0.008332161;
      afStack_f08[0] = 0.008332161;
      afStack_f08[1] = 0.008332161;
      local_19e0._4_4_ = fStack_efc + 0.008332161;
      local_19e0._0_4_ = local_f00 + 0.008332161;
      uStack_19d8._0_4_ = fStack_ef8 + 0.008332161;
      uStack_19d8._4_4_ = fStack_ef4 + 0.008332161;
      uStack_19d0._0_4_ = fStack_ef0 + 0.008332161;
      uStack_19d0._4_4_ = fStack_eec + 0.008332161;
      auVar53 = _local_19e0;
      uStack_19c8._0_4_ = fStack_ee8 + 0.008332161;
      uStack_19c8._4_4_ = fStack_19a4 + 0.008332161;
      auVar1 = _local_19e0;
      local_1398 = _ps256_sincof_p2;
      local_1360 = local_19e0;
      uStack_1358 = uStack_19d8;
      uStack_19d0 = auVar53._16_8_;
      uStack_1350 = uStack_19d0;
      uStack_19c8 = auVar1._24_8_;
      uStack_1348 = uStack_19c8;
      local_1380 = CONCAT44(fStack_19bc,local_19c0);
      uStack_1378 = CONCAT44(fStack_19b4,fStack_19b8);
      uStack_1370 = CONCAT44(fStack_19ac,fStack_19b0);
      uStack_1368 = CONCAT44(fStack_19a4,fStack_19a8);
      local_ec0 = (local_f00 + 0.008332161) * local_19c0;
      fStack_ebc = (fStack_efc + 0.008332161) * fStack_19bc;
      fStack_eb8 = (fStack_ef8 + 0.008332161) * fStack_19b8;
      fStack_eb4 = (fStack_ef4 + 0.008332161) * fStack_19b4;
      fStack_eb0 = (fStack_ef0 + 0.008332161) * fStack_19b0;
      fStack_eac = (fStack_eec + 0.008332161) * fStack_19ac;
      fStack_ea8 = (fStack_ee8 + 0.008332161) * fStack_19a8;
      local_ee0[0] = -0.16666655;
      local_ee0[1] = -0.16666655;
      afStack_ed8[0] = -0.16666655;
      afStack_ed8[1] = -0.16666655;
      afStack_ed0[0] = -0.16666655;
      afStack_ed0[1] = -0.16666655;
      afStack_ec8[0] = -0.16666655;
      afStack_ec8[1] = -0.16666655;
      local_19e0._4_4_ = fStack_ebc + -0.16666655;
      local_19e0._0_4_ = local_ec0 + -0.16666655;
      uStack_19d8._0_4_ = fStack_eb8 + -0.16666655;
      uStack_19d8._4_4_ = fStack_eb4 + -0.16666655;
      uStack_19d0._0_4_ = fStack_eb0 + -0.16666655;
      uStack_19d0._4_4_ = fStack_eac + -0.16666655;
      auVar53 = _local_19e0;
      uStack_19c8._0_4_ = fStack_ea8 + -0.16666655;
      uStack_19c8._4_4_ = fStack_19a4 + -0.16666655;
      auVar1 = _local_19e0;
      uStack_19d0 = auVar53._16_8_;
      uStack_19c8 = auVar1._24_8_;
      local_1540 = CONCAT44(fStack_19bc,local_19c0);
      uStack_1538 = CONCAT44(fStack_19b4,fStack_19b8);
      uStack_1530 = CONCAT44(fStack_19ac,fStack_19b0);
      uStack_1528 = CONCAT44(fStack_19a4,fStack_19a8);
      local_1520 = local_19e0;
      uStack_1518 = uStack_19d8;
      uStack_1510 = uStack_19d0;
      uStack_1508 = uStack_19c8;
      local_19e0._0_4_ = (local_ec0 + -0.16666655) * local_19c0;
      local_19e0._4_4_ = (fStack_ebc + -0.16666655) * fStack_19bc;
      fStack_e78 = (fStack_eb8 + -0.16666655) * fStack_19b8;
      fStack_e74 = (fStack_eb4 + -0.16666655) * fStack_19b4;
      fStack_e70 = (fStack_eb0 + -0.16666655) * fStack_19b0;
      fStack_e6c = (fStack_eac + -0.16666655) * fStack_19ac;
      fStack_e68 = (fStack_ea8 + -0.16666655) * fStack_19a8;
      uStack_19d8._0_4_ = fStack_e78;
      uStack_19d8._4_4_ = fStack_e74;
      uStack_19d0._0_4_ = fStack_e70;
      uStack_19d0._4_4_ = fStack_e6c;
      auVar53 = _local_19e0;
      uStack_19c8._0_4_ = fStack_e68;
      auVar1 = _local_19e0;
      local_13c0 = local_19e0;
      uStack_13b8 = uStack_19d8;
      uStack_19d0 = auVar53._16_8_;
      uStack_13b0 = uStack_19d0;
      uStack_19c8 = auVar1._24_8_;
      uStack_13a8 = uStack_19c8;
      local_13e0 = local_1720;
      uStack_13d8 = uStack_1718;
      uStack_13d0 = uStack_1710;
      uStack_13c8 = uStack_1708;
      local_e80 = (float)local_19e0._0_4_ * fVar94;
      fStack_e7c = (float)local_19e0._4_4_ * fVar95;
      fStack_e78 = fStack_e78 * fVar96;
      fStack_e74 = fStack_e74 * fVar97;
      fStack_e70 = fStack_e70 * fVar98;
      fStack_e6c = fStack_e6c * fVar99;
      fStack_e68 = fStack_e68 * fVar100;
      local_ea0 = local_1720;
      uStack_e98 = uStack_1718;
      uStack_e90 = uStack_1710;
      uStack_e88 = uStack_1708;
      local_19e0._4_4_ = fStack_e7c + fVar95;
      local_19e0._0_4_ = local_e80 + fVar94;
      uStack_19d8._0_4_ = fStack_e78 + fVar96;
      uStack_19d8._4_4_ = fStack_e74 + fVar97;
      uStack_19d0._0_4_ = fStack_e70 + fVar98;
      uStack_19d0._4_4_ = fStack_e6c + fVar99;
      auVar53 = _local_19e0;
      uStack_19c8._0_4_ = fStack_e68 + fVar100;
      uStack_19c8._4_4_ = fStack_19a4 + fStack_19a4;
      auVar1 = _local_19e0;
      local_17a0 = local_1870._0_8_;
      uStack_1798 = local_1870._8_8_;
      uStack_1790 = local_1880._0_8_;
      uStack_1788 = local_1880._8_8_;
      uStack_19d0 = auVar53._16_8_;
      uStack_19c8 = auVar1._24_8_;
      local_1680 = local_1870._0_8_;
      uStack_1678 = local_1870._8_8_;
      uStack_1670 = local_1880._0_8_;
      uStack_1668 = local_1880._8_8_;
      local_16a0 = local_19e0;
      uStack_1698 = uStack_19d8;
      uStack_1690 = uStack_19d0;
      uStack_1688 = uStack_19c8;
      auVar13._16_8_ = local_1880._0_8_;
      auVar13._0_16_ = local_1870;
      auVar13._24_8_ = local_1880._8_8_;
      auVar12._16_8_ = uStack_19d0;
      auVar12._0_16_ = _local_19e0;
      auVar12._24_8_ = uStack_19c8;
      local_1a00 = vandps_avx(auVar13,auVar12);
      uStack_17d0 = auVar54._16_8_;
      uStack_17c8 = auVar2._24_8_;
      local_a60 = local_1870._0_8_;
      uStack_a58 = local_1870._8_8_;
      uStack_a50 = local_1880._0_8_;
      uStack_a48 = local_1880._8_8_;
      local_a80 = local_17e0;
      uStack_a78 = uStack_17d8;
      uStack_a70 = uStack_17d0;
      uStack_a68 = uStack_17c8;
      auVar29._16_8_ = local_1880._0_8_;
      auVar29._0_16_ = local_1870;
      auVar29._24_8_ = local_1880._8_8_;
      auVar28._16_8_ = uStack_17d0;
      auVar28._0_16_ = _local_17e0;
      auVar28._24_8_ = uStack_17c8;
      local_1a20 = vandnps_avx(auVar29,auVar28);
      local_1580 = local_19e0;
      uStack_1578 = uStack_19d8;
      uStack_1570 = uStack_19d0;
      uStack_1568 = uStack_19c8;
      local_15a0 = local_1a00._0_8_;
      uStack_1598 = local_1a00._8_8_;
      uStack_1590 = local_1a00._16_8_;
      uStack_1588 = local_1a00._24_8_;
      auVar17._16_8_ = uStack_19d0;
      auVar17._0_16_ = _local_19e0;
      auVar17._24_8_ = uStack_19c8;
      _local_19e0 = vsubps_avx(auVar17,local_1a00);
      local_15c0 = local_17e0;
      uStack_15b8 = uStack_17d8;
      uStack_15b0 = uStack_17d0;
      uStack_15a8 = uStack_17c8;
      local_15e0 = local_1a20._0_8_;
      uStack_15d8 = local_1a20._8_8_;
      uStack_15d0 = local_1a20._16_8_;
      uStack_15c8 = local_1a20._24_8_;
      auVar16._16_8_ = uStack_17d0;
      auVar16._0_16_ = _local_17e0;
      auVar16._24_8_ = uStack_17c8;
      _local_17e0 = vsubps_avx(auVar16,local_1a20);
      local_e00 = local_1a20._0_8_;
      uVar72 = local_e00;
      uStack_df8 = local_1a20._8_8_;
      uVar73 = uStack_df8;
      uStack_df0 = local_1a20._16_8_;
      uVar74 = uStack_df0;
      uStack_de8 = local_1a20._24_8_;
      uVar75 = uStack_de8;
      local_e20 = local_1a00._0_8_;
      uVar68 = local_e20;
      uStack_e18 = local_1a00._8_8_;
      uVar69 = uStack_e18;
      uStack_e10 = local_1a00._16_8_;
      uVar70 = uStack_e10;
      uStack_e08 = local_1a00._24_8_;
      uVar71 = uStack_e08;
      local_e00._0_4_ = local_1a20._0_4_;
      local_e00._4_4_ = local_1a20._4_4_;
      uStack_df8._0_4_ = local_1a20._8_4_;
      uStack_df8._4_4_ = local_1a20._12_4_;
      uStack_df0._0_4_ = local_1a20._16_4_;
      uStack_df0._4_4_ = local_1a20._20_4_;
      uStack_de8._0_4_ = local_1a20._24_4_;
      uStack_de8._4_4_ = local_1a20._28_4_;
      local_e20._0_4_ = local_1a00._0_4_;
      local_e20._4_4_ = local_1a00._4_4_;
      uStack_e18._0_4_ = local_1a00._8_4_;
      uStack_e18._4_4_ = local_1a00._12_4_;
      uStack_e10._0_4_ = local_1a00._16_4_;
      uStack_e10._4_4_ = local_1a00._20_4_;
      uStack_e08._0_4_ = local_1a00._24_4_;
      uStack_e08._4_4_ = local_1a00._28_4_;
      local_1760 = CONCAT44(local_e00._4_4_ + local_e20._4_4_,(float)local_e00 + (float)local_e20);
      uStack_1758 = CONCAT44(uStack_df8._4_4_ + uStack_e18._4_4_,
                             (float)uStack_df8 + (float)uStack_e18);
      uStack_1750 = CONCAT44(uStack_df0._4_4_ + uStack_e10._4_4_,
                             (float)uStack_df0 + (float)uStack_e10);
      uStack_1748 = CONCAT44(uStack_de8._4_4_ + uStack_e08._4_4_,
                             (float)uStack_de8 + (float)uStack_e08);
      local_e40 = local_17e0;
      uVar64 = local_e40;
      uStack_e38 = uStack_17d8;
      uVar65 = uStack_e38;
      uStack_e30 = uStack_17d0;
      uVar66 = uStack_e30;
      uStack_e28 = uStack_17c8;
      uVar67 = uStack_e28;
      local_e60 = local_19e0;
      uVar60 = local_e60;
      uStack_e58 = uStack_19d8;
      uVar61 = uStack_e58;
      uStack_e50 = uStack_19d0;
      uVar62 = uStack_e50;
      uStack_e48 = uStack_19c8;
      uVar63 = uStack_e48;
      local_e40._0_4_ = local_17e0._0_4_;
      local_e40._4_4_ = local_17e0._4_4_;
      uStack_e38._0_4_ = local_17e0._8_4_;
      uStack_e38._4_4_ = local_17e0._12_4_;
      uStack_e30._0_4_ = local_17e0._16_4_;
      uStack_e30._4_4_ = local_17e0._20_4_;
      uStack_e28._0_4_ = local_17e0._24_4_;
      uStack_e28._4_4_ = local_17e0._28_4_;
      local_e60._0_4_ = local_19e0._0_4_;
      local_e60._4_4_ = local_19e0._4_4_;
      uStack_e58._0_4_ = local_19e0._8_4_;
      uStack_e58._4_4_ = local_19e0._12_4_;
      uStack_e50._0_4_ = local_19e0._16_4_;
      uStack_e50._4_4_ = local_19e0._20_4_;
      uStack_e48._0_4_ = local_19e0._24_4_;
      uStack_e48._4_4_ = local_19e0._28_4_;
      local_1780 = CONCAT44(local_e40._4_4_ + local_e60._4_4_,(float)local_e40 + (float)local_e60);
      uStack_1778 = CONCAT44(uStack_e38._4_4_ + uStack_e58._4_4_,
                             (float)uStack_e38 + (float)uStack_e58);
      uStack_1770 = CONCAT44(uStack_e30._4_4_ + uStack_e50._4_4_,
                             (float)uStack_e30 + (float)uStack_e50);
      uStack_1768 = CONCAT44(uStack_e28._4_4_ + uStack_e48._4_4_,
                             (float)uStack_e28 + (float)uStack_e48);
      uStack_17b0 = auVar55._16_8_;
      uStack_17a8 = auVar14._24_8_;
      local_ae0 = local_1760;
      uStack_ad8 = uStack_1758;
      uStack_ad0 = uStack_1750;
      uStack_ac8 = uStack_1748;
      local_b00 = local_17c0;
      uStack_af8 = uStack_17b8;
      uStack_af0 = uStack_17b0;
      uStack_ae8 = uStack_17a8;
      local_1b20._0_4_ =
           (uint)((float)local_e00 + (float)local_e20) ^ (uint)local_aa0 ^ (uint)local_ac0;
      local_1b20._4_4_ =
           (uint)(local_e00._4_4_ + local_e20._4_4_) ^ local_aa0._4_4_ ^ local_ac0._4_4_;
      local_1b20._8_4_ =
           (uint)((float)uStack_df8 + (float)uStack_e18) ^ (uint)uStack_a98 ^ (uint)uStack_ab8;
      local_1b20._12_4_ =
           (uint)(uStack_df8._4_4_ + uStack_e18._4_4_) ^ uStack_a98._4_4_ ^ uStack_ab8._4_4_;
      local_1b20._16_4_ =
           (uint)((float)uStack_df0 + (float)uStack_e10) ^ (uint)uStack_a90 ^ (uint)uStack_ab0;
      local_1b20._20_4_ =
           (uint)(uStack_df0._4_4_ + uStack_e10._4_4_) ^ uStack_a90._4_4_ ^ uStack_ab0._4_4_;
      local_1b20._24_4_ =
           (uint)((float)uStack_de8 + (float)uStack_e08) ^ (uint)uStack_a88 ^ (uint)uStack_aa8;
      local_1b20._28_4_ =
           (uint)(uStack_de8._4_4_ + uStack_e08._4_4_) ^ uStack_a88._4_4_ ^ uStack_aa8._4_4_;
      local_b20 = local_1780;
      uStack_b18 = uStack_1778;
      uStack_b10 = uStack_1770;
      uStack_b08 = uStack_1768;
      local_b40 = local_1890._0_8_;
      uStack_b38 = local_1890._8_8_;
      uStack_b30 = local_18a0._0_8_;
      uStack_b28 = local_18a0._8_8_;
      local_1b40 = (float)((uint)((float)local_e40 + (float)local_e60) ^ local_1890._0_4_);
      fStack_1b3c = (float)((uint)(local_e40._4_4_ + local_e60._4_4_) ^ local_1890._4_4_);
      fStack_1b38 = (float)((uint)((float)uStack_e38 + (float)uStack_e58) ^ local_1890._8_4_);
      fStack_1b34 = (float)((uint)(uStack_e38._4_4_ + uStack_e58._4_4_) ^ local_1890._12_4_);
      fStack_1b30 = (float)((uint)((float)uStack_e30 + (float)uStack_e50) ^ local_18a0._0_4_);
      fStack_1b2c = (float)((uint)(uStack_e30._4_4_ + uStack_e50._4_4_) ^ local_18a0._4_4_);
      fStack_1b28 = (float)((uint)((float)uStack_e28 + (float)uStack_e48) ^ local_18a0._8_4_);
      fStack_1b24 = (float)((uint)(uStack_e28._4_4_ + uStack_e48._4_4_) ^ local_18a0._12_4_);
      auVar1._4_4_ = fStack_1b3c;
      auVar1._0_4_ = local_1b40;
      auVar1._8_4_ = fStack_1b38;
      auVar1._12_4_ = fStack_1b34;
      auVar1._16_4_ = fStack_1b30;
      auVar1._20_4_ = fStack_1b2c;
      auVar1._24_4_ = fStack_1b28;
      auVar1._28_4_ = fStack_1b24;
      local_1b80 = vcmpps_avx(auVar1,local_1aa0,0);
      local_1ac0 = local_9c0._0_8_;
      uStack_1ab8 = local_9c0._8_8_;
      uStack_1ab0 = auStack_9b0._0_8_;
      uStack_1aa8 = auStack_9b0._8_8_;
      local_1ae0 = local_1b80._0_8_;
      uStack_1ad8 = local_1b80._8_8_;
      uStack_1ad0 = local_1b80._16_8_;
      uStack_1ac8 = local_1b80._24_8_;
      auVar2._16_8_ = auStack_9b0._0_8_;
      auVar2._0_16_ = local_9c0;
      auVar2._24_8_ = auStack_9b0._8_8_;
      local_1ba0 = vandps_avx(auVar2,local_1b80);
      local_1a60 = CONCAT44(fStack_1b3c,local_1b40);
      uStack_1a58 = CONCAT44(fStack_1b34,fStack_1b38);
      uStack_1a50 = CONCAT44(fStack_1b2c,fStack_1b30);
      uStack_1a48 = CONCAT44(fStack_1b24,fStack_1b28);
      local_1a80._0_4_ = local_1ba0._0_4_;
      local_1a80._4_4_ = local_1ba0._4_4_;
      uStack_1a78._0_4_ = local_1ba0._8_4_;
      uStack_1a78._4_4_ = local_1ba0._12_4_;
      uStack_1a70._0_4_ = local_1ba0._16_4_;
      uStack_1a70._4_4_ = local_1ba0._20_4_;
      uStack_1a68._0_4_ = local_1ba0._24_4_;
      uStack_1a68._4_4_ = local_1ba0._28_4_;
      local_1b40 = local_1b40 + (float)local_1a80;
      fStack_1b3c = fStack_1b3c + local_1a80._4_4_;
      fStack_1b38 = fStack_1b38 + (float)uStack_1a78;
      fStack_1b34 = fStack_1b34 + uStack_1a78._4_4_;
      fStack_1b30 = fStack_1b30 + (float)uStack_1a70;
      fStack_1b2c = fStack_1b2c + uStack_1a70._4_4_;
      fStack_1b28 = fStack_1b28 + (float)uStack_1a68;
      fStack_1b24 = fStack_1b24 + uStack_1a68._4_4_;
      local_a00 = CONCAT44(fStack_1b3c,local_1b40);
      uStack_9f8 = CONCAT44(fStack_1b34,fStack_1b38);
      uStack_9f0 = CONCAT44(fStack_1b2c,fStack_1b30);
      uStack_9e8 = CONCAT44(fStack_1b24,fStack_1b28);
      auVar32._8_8_ = uStack_9f8;
      auVar32._0_8_ = local_a00;
      auVar32._16_8_ = uStack_9f0;
      auVar32._24_8_ = uStack_9e8;
      local_1bc0 = vdivps_avx(local_1b20,auVar32);
      local_1da0 = local_1bc0._0_8_;
      uStack_1d98 = local_1bc0._8_8_;
      uStack_1d90 = local_1bc0._16_8_;
      uStack_1d88 = local_1bc0._24_8_;
      local_1c90 = local_1d30;
      local_1cc0 = local_1bc0._0_8_;
      uStack_1cb8 = local_1bc0._8_8_;
      uStack_1cb0 = local_1bc0._16_8_;
      uStack_1ca8 = local_1bc0._24_8_;
      *local_1d30 = local_1bc0;
      local_1d30 = local_1d30 + 1;
      local_1a80 = local_1ba0._0_8_;
      uStack_1a78 = local_1ba0._8_8_;
      uStack_1a70 = local_1ba0._16_8_;
      uStack_1a68 = local_1ba0._24_8_;
      _local_17c0 = auVar14;
      _local_1720 = auVar15;
      uStack_1630 = uStack_1af0;
      uStack_1628 = uStack_1ae8;
      uStack_15f0 = uStack_1af0;
      uStack_15e8 = uStack_1ae8;
      local_1560 = local_1aa0;
      local_1420 = uVar56;
      uStack_1418 = uVar57;
      uStack_1410 = uVar58;
      uStack_1408 = uVar59;
      local_13f0 = local_13f8;
      local_1388 = local_13e8;
      local_1330 = local_1390;
      local_1328 = local_13e8;
      local_12d0 = local_1390;
      local_1270 = local_1390;
      local_1268 = local_12c8;
      local_1218 = local_13f8;
      local_1208 = local_12c8;
      local_11b8 = local_13f8;
      local_11a8 = local_12c8;
      local_1158 = local_13f8;
      local_1148 = local_12c8;
      local_1120 = uVar8;
      uStack_1118 = uVar9;
      uStack_1110 = uVar10;
      uStack_1108 = uVar11;
      local_10f8 = local_12c8;
      local_10e8 = local_1390;
      fStack_10c4 = fStack_19a4;
      fStack_f64 = fStack_19a4;
      fStack_f24 = fStack_19a4;
      fStack_ee4 = fStack_19a4;
      fStack_ea4 = fStack_19a4;
      fStack_e64 = fStack_19a4;
      local_e60 = uVar60;
      uStack_e58 = uVar61;
      uStack_e50 = uVar62;
      uStack_e48 = uVar63;
      local_e40 = uVar64;
      uStack_e38 = uVar65;
      uStack_e30 = uVar66;
      uStack_e28 = uVar67;
      local_e20 = uVar68;
      uStack_e18 = uVar69;
      uStack_e10 = uVar70;
      uStack_e08 = uVar71;
      local_e00 = uVar72;
      uStack_df8 = uVar73;
      uStack_df0 = uVar74;
      uStack_de8 = uVar75;
      local_dc0 = uVar76;
      uStack_db8 = uVar77;
      uStack_db0 = uVar78;
      uStack_da8 = uVar79;
      local_b50 = local_b60;
      local_ac0 = uVar80;
      uStack_ab8 = uVar81;
      uStack_ab0 = uVar82;
      uStack_aa8 = uVar83;
      local_aa0 = uVar84;
      uStack_a98 = uVar85;
      uStack_a90 = uVar86;
      uStack_a88 = uVar87;
    }
    for (; local_1c18 = local_1cd0, local_1d58 = local_1c68, local_1d7c + 3 < local_1d24;
        local_1d7c = local_1d7c + 4) {
      local_1c88 = local_1d30;
      local_910 = *(undefined8 *)*local_1d30;
      uStack_908 = *(undefined8 *)(*local_1d30 + 8);
      local_1bd8 = local_1d09;
      local_1be0 = &local_1db0;
      local_894 = 0x322bcc77;
      local_8b0 = 0x322bcc77;
      uStack_8ac = 0x322bcc77;
      uStack_8a8 = 0x322bcc77;
      uStack_8a4 = 0x322bcc77;
      local_940 = 0x322bcc77322bcc77;
      uStack_938 = 0x322bcc77322bcc77;
      local_798 = local_920;
      local_7a0 = &local_930;
      local_8e0 = ZEXT816(0) << 0x20;
      local_6b0._8_8_ = SUB168(ZEXT816(0),4);
      local_710 = 0x7fffffff7fffffff;
      uStack_708 = 0x7fffffff7fffffff;
      auVar36._8_8_ = 0x7fffffff7fffffff;
      auVar36._0_8_ = 0x7fffffff7fffffff;
      auVar3 = vpand_avx(*(undefined1 (*) [16])*local_1d30,auVar36);
      local_730 = 0x8000000080000000;
      uStack_728 = 0x8000000080000000;
      auVar35._8_8_ = 0x8000000080000000;
      auVar35._0_8_ = 0x8000000080000000;
      auVar4 = vpand_avx(*(undefined1 (*) [16])*local_1d30,auVar35);
      local_790 = auVar3._0_8_;
      uStack_788 = auVar3._8_8_;
      local_610 = local_790;
      uVar10 = local_610;
      uStack_608 = uStack_788;
      uVar11 = uStack_608;
      local_620 = 0x3fa2f9833fa2f983;
      uStack_618 = 0x3fa2f9833fa2f983;
      local_610._0_4_ = auVar3._0_4_;
      local_610._4_4_ = auVar3._4_4_;
      uStack_608._0_4_ = auVar3._8_4_;
      uStack_608._4_4_ = auVar3._12_4_;
      local_7f0._4_4_ = local_610._4_4_ * 1.2732395;
      local_7f0._0_4_ = (float)local_610 * 1.2732395;
      uStack_7e8._0_4_ = (float)uStack_608 * 1.2732395;
      uStack_7e8._4_4_ = uStack_608._4_4_ * 1.2732395;
      local_540 = local_7f0;
      uStack_538 = uStack_7e8;
      local_810._4_4_ = (int)(local_610._4_4_ * 1.2732395);
      local_810._0_4_ = (int)((float)local_610 * 1.2732395);
      local_810._8_4_ = (int)((float)uStack_608 * 1.2732395);
      local_810._12_4_ = (int)(uStack_608._4_4_ * 1.2732395);
      local_5f0 = local_810._0_8_;
      uStack_5e8 = local_810._8_8_;
      local_600 = 0x100000001;
      uStack_5f8 = 0x100000001;
      auVar40._8_8_ = local_810._8_8_;
      auVar40._0_8_ = local_810._0_8_;
      auVar39._8_8_ = 0x100000001;
      auVar39._0_8_ = 0x100000001;
      auVar3 = vpaddd_avx(auVar40,auVar39);
      local_810._0_8_ = auVar3._0_8_;
      local_810._8_8_ = auVar3._8_8_;
      local_150 = local_810._0_8_;
      uStack_148 = local_810._8_8_;
      local_160 = 0xfffffffefffffffe;
      uStack_158 = 0xfffffffefffffffe;
      auVar45._8_8_ = 0xfffffffefffffffe;
      auVar45._0_8_ = 0xfffffffefffffffe;
      auVar5 = vpand_avx(auVar3,auVar45);
      local_810._0_8_ = auVar5._0_8_;
      local_1b0 = local_810._0_8_;
      local_810._8_8_ = auVar5._8_8_;
      uStack_1a8 = local_810._8_8_;
      local_530 = local_810._0_8_;
      uStack_528 = local_810._8_8_;
      auVar3 = vcvtdq2ps_avx(auVar5);
      local_170 = local_810._0_8_;
      uStack_168 = local_810._8_8_;
      local_180 = 0x400000004;
      uStack_178 = 0x400000004;
      auVar44._8_8_ = 0x400000004;
      auVar44._0_8_ = 0x400000004;
      auVar6 = vpand_avx(auVar5,auVar44);
      local_800._0_8_ = auVar6._0_8_;
      local_800._8_8_ = auVar6._8_8_;
      local_5b0 = local_800._0_8_;
      uStack_5a8 = local_800._8_8_;
      local_5b4 = 0x1d;
      local_800 = vpslld_avx(auVar6,ZEXT416(0x1d));
      local_760 = local_800._0_8_;
      uStack_758 = local_800._8_8_;
      local_830 = local_800._0_8_;
      uStack_828 = local_800._8_8_;
      local_190 = local_810._0_8_;
      uStack_188 = local_810._8_8_;
      local_1a0 = 0x200000002;
      uStack_198 = 0x200000002;
      auVar43._8_8_ = 0x200000002;
      auVar43._0_8_ = 0x200000002;
      auVar6 = vpand_avx(auVar5,auVar43);
      local_810._0_8_ = auVar6._0_8_;
      local_810._8_8_ = auVar6._8_8_;
      local_120._8_8_ = SUB168(ZEXT816(0),4);
      local_130 = local_810._0_8_;
      uStack_128 = local_810._8_8_;
      local_140 = 0;
      uStack_138 = local_120._8_8_;
      auVar51._8_8_ = 0;
      auVar51._0_8_ = local_120._8_8_;
      local_810 = vpcmpeqd_avx(auVar6,auVar51 << 0x40);
      local_770 = local_810._0_8_;
      uStack_768 = local_810._8_8_;
      local_840 = local_810._0_8_;
      uStack_838 = local_810._8_8_;
      local_518 = local_7f0;
      local_210 = &local_7b0;
      local_4b8 = &local_790;
      local_7f0 = auVar3._0_8_;
      uVar8 = local_7f0;
      uStack_7e8 = auVar3._8_8_;
      uVar9 = uStack_7e8;
      local_200 = 0xbf490000bf490000;
      uStack_1f8 = 0xbf490000bf490000;
      local_1f0._0_4_ = auVar3._0_4_;
      local_1f0._4_4_ = auVar3._4_4_;
      uStack_1e8._0_4_ = auVar3._8_4_;
      uStack_1e8._4_4_ = auVar3._12_4_;
      local_1d0 = (float)local_1f0 * -0.78515625;
      fStack_1cc = local_1f0._4_4_ * -0.78515625;
      fStack_1c8 = (float)uStack_1e8 * -0.78515625;
      fStack_1c4 = uStack_1e8._4_4_ * -0.78515625;
      local_1e0 = local_790;
      uStack_1d8 = uStack_788;
      local_790 = CONCAT44(fStack_1cc + local_610._4_4_,local_1d0 + (float)local_610);
      uStack_788._0_4_ = fStack_1c8 + (float)uStack_608;
      uStack_788._4_4_ = fStack_1c4 + uStack_608._4_4_;
      local_270 = &local_7c0;
      local_250 = local_7f0;
      uStack_248 = uStack_7e8;
      local_260 = 0xb97da000b97da000;
      uStack_258 = 0xb97da000b97da000;
      local_230 = (float)local_1f0 * -0.00024187565;
      fStack_22c = local_1f0._4_4_ * -0.00024187565;
      fStack_228 = (float)uStack_1e8 * -0.00024187565;
      fStack_224 = uStack_1e8._4_4_ * -0.00024187565;
      local_240 = local_790;
      uStack_238 = uStack_788;
      fVar90 = local_230 + local_1d0 + (float)local_610;
      fVar91 = fStack_22c + fStack_1cc + local_610._4_4_;
      fVar92 = fStack_228 + fStack_1c8 + (float)uStack_608;
      fVar93 = fStack_224 + fStack_1c4 + uStack_608._4_4_;
      local_790 = CONCAT44(fVar91,fVar90);
      uStack_788._0_4_ = fVar92;
      uStack_788._4_4_ = fVar93;
      local_2d0 = &local_7d0;
      local_2b0 = local_7f0;
      uStack_2a8 = uStack_7e8;
      local_2c0 = 0xb3222169b3222169;
      uStack_2b8 = 0xb3222169b3222169;
      local_290 = (float)local_1f0 * -3.774895e-08;
      fStack_28c = local_1f0._4_4_ * -3.774895e-08;
      fStack_288 = (float)uStack_1e8 * -3.774895e-08;
      fStack_284 = uStack_1e8._4_4_ * -3.774895e-08;
      local_2a0 = local_790;
      uStack_298 = uStack_788;
      fVar90 = local_290 + fVar90;
      fVar91 = fStack_28c + fVar91;
      fVar92 = fStack_288 + fVar92;
      fVar93 = fStack_284 + fVar93;
      local_790 = CONCAT44(fVar91,fVar90);
      uStack_788._0_4_ = fVar92;
      uStack_788._4_4_ = fVar93;
      local_1c0 = 0x200000002;
      uStack_1b8 = 0x200000002;
      auVar42._8_8_ = 0x200000002;
      auVar42._0_8_ = 0x200000002;
      auVar3 = vpsubd_avx(auVar5,auVar42);
      local_820._0_8_ = auVar3._0_8_;
      local_820._8_8_ = auVar3._8_8_;
      local_80 = local_820._0_8_;
      uStack_78 = local_820._8_8_;
      local_90 = 0x400000004;
      uStack_88 = 0x400000004;
      auVar47._8_8_ = 0x400000004;
      auVar47._0_8_ = 0x400000004;
      auVar3 = vpandn_avx(auVar3,auVar47);
      local_820._0_8_ = auVar3._0_8_;
      local_820._8_8_ = auVar3._8_8_;
      local_5d0 = local_820._0_8_;
      uStack_5c8 = local_820._8_8_;
      local_5d4 = 0x1d;
      local_820 = vpslld_avx(auVar3,ZEXT416(0x1d));
      local_780 = local_820._0_8_;
      uStack_778 = local_820._8_8_;
      local_850 = local_820._0_8_;
      uStack_848 = local_820._8_8_;
      local_7e0 = auVar4._0_8_;
      uStack_7d8 = auVar4._8_8_;
      local_c0 = local_7e0;
      uStack_b8 = uStack_7d8;
      local_d0 = local_800._0_8_;
      uStack_c8 = local_800._8_8_;
      local_f0 = local_7e0 ^ local_800._0_8_;
      uStack_e8 = uStack_7d8 ^ local_800._8_8_;
      uStack_7d8 = uStack_e8;
      local_7e0 = local_f0;
      local_630 = local_790;
      uStack_628 = uStack_788;
      local_640 = local_790;
      uStack_638 = uStack_788;
      local_860 = fVar90 * fVar90;
      fStack_85c = fVar91 * fVar91;
      fStack_858 = fVar92 * fVar92;
      fStack_854 = fVar93 * fVar93;
      local_508 = &local_860;
      local_338 = _ps_coscof_p1;
      local_310 = 0x37ccf5ce37ccf5ce;
      uStack_308 = 0x37ccf5ce37ccf5ce;
      local_320 = CONCAT44(fStack_85c,local_860);
      uStack_318 = CONCAT44(fStack_854,fStack_858);
      local_2f0 = local_860 * 2.4433157e-05;
      fStack_2ec = fStack_85c * 2.4433157e-05;
      fStack_2e8 = fStack_858 * 2.4433157e-05;
      fStack_2e4 = fStack_854 * 2.4433157e-05;
      local_300[0] = -0.0013887316;
      local_300[1] = -0.0013887316;
      afStack_2f8[0] = -0.0013887316;
      afStack_2f8[1] = -0.0013887316;
      local_7f0._4_4_ = fStack_2ec + -0.0013887316;
      local_7f0._0_4_ = local_2f0 + -0.0013887316;
      uStack_7e8._0_4_ = fStack_2e8 + -0.0013887316;
      uStack_7e8._4_4_ = fStack_2e4 + -0.0013887316;
      local_398 = _ps_coscof_p2;
      local_370 = local_7f0;
      uStack_368 = uStack_7e8;
      local_380 = CONCAT44(fStack_85c,local_860);
      uStack_378 = CONCAT44(fStack_854,fStack_858);
      local_350 = (local_2f0 + -0.0013887316) * local_860;
      fStack_34c = (fStack_2ec + -0.0013887316) * fStack_85c;
      fStack_348 = (fStack_2e8 + -0.0013887316) * fStack_858;
      fStack_344 = (fStack_2e4 + -0.0013887316) * fStack_854;
      local_360[0] = 0.041666646;
      local_360[1] = 0.041666646;
      afStack_358[0] = 0.041666646;
      afStack_358[1] = 0.041666646;
      local_7f0._4_4_ = fStack_34c + 0.041666646;
      local_7f0._0_4_ = local_350 + 0.041666646;
      uStack_7e8._0_4_ = fStack_348 + 0.041666646;
      uStack_7e8._4_4_ = fStack_344 + 0.041666646;
      local_660 = CONCAT44(fStack_85c,local_860);
      uStack_658 = CONCAT44(fStack_854,fStack_858);
      local_650 = local_7f0;
      uStack_648 = uStack_7e8;
      local_7f0._0_4_ = (local_350 + 0.041666646) * local_860;
      local_7f0._4_4_ = (fStack_34c + 0.041666646) * fStack_85c;
      fVar88 = (fStack_348 + 0.041666646) * fStack_858;
      fVar89 = (fStack_344 + 0.041666646) * fStack_854;
      uStack_7e8._0_4_ = fVar88;
      uStack_7e8._4_4_ = fVar89;
      local_680 = CONCAT44(fStack_85c,local_860);
      uStack_678 = CONCAT44(fStack_854,fStack_858);
      local_670 = local_7f0;
      uStack_668 = uStack_7e8;
      local_7f0._4_4_ = (float)local_7f0._4_4_ * fStack_85c;
      local_7f0._0_4_ = (float)local_7f0._0_4_ * local_860;
      uStack_7e8._0_4_ = fVar88 * fStack_858;
      uStack_7e8._4_4_ = fVar89 * fStack_854;
      local_510 = ::_ps_0p5;
      local_4f0 = local_7f0;
      uStack_4e8 = uStack_7e8;
      local_4d0 = CONCAT44(fStack_85c,local_860);
      uStack_4c8 = CONCAT44(fStack_854,fStack_858);
      local_4e0[0] = 0.5;
      local_4e0[1] = 0.5;
      afStack_4d8[0] = 0.5;
      afStack_4d8[1] = 0.5;
      local_500 = local_860 * 0.5;
      fStack_4fc = fStack_85c * 0.5;
      fStack_4f8 = fStack_858 * 0.5;
      fStack_4f4 = fStack_854 * 0.5;
      auVar41._4_4_ = fStack_4fc;
      auVar41._0_4_ = local_500;
      auVar41._8_4_ = fStack_4f8;
      auVar41._12_4_ = fStack_4f4;
      auVar3 = vsubps_avx(_local_7f0,auVar41);
      local_7f0 = auVar3._0_8_;
      uStack_7e8 = auVar3._8_8_;
      local_550 = local_7f0;
      uVar64 = local_550;
      uStack_548 = uStack_7e8;
      uVar65 = uStack_548;
      local_560 = 0x3f8000003f800000;
      uStack_558 = 0x3f8000003f800000;
      local_550._0_4_ = auVar3._0_4_;
      local_550._4_4_ = auVar3._4_4_;
      uStack_548._0_4_ = auVar3._8_4_;
      uStack_548._4_4_ = auVar3._12_4_;
      local_7f0._4_4_ = local_550._4_4_ + 1.0;
      local_7f0._0_4_ = (float)local_550 + 1.0;
      uStack_7e8._0_4_ = (float)uStack_548 + 1.0;
      uStack_7e8._4_4_ = uStack_548._4_4_ + 1.0;
      local_4a8 = local_870;
      local_3f8 = _ps_sincof_p1;
      local_3d0 = 0xb94ca1f9b94ca1f9;
      uStack_3c8 = 0xb94ca1f9b94ca1f9;
      local_3e0 = CONCAT44(fStack_85c,local_860);
      uStack_3d8 = CONCAT44(fStack_854,fStack_858);
      local_3b0 = local_860 * -0.00019515296;
      fStack_3ac = fStack_85c * -0.00019515296;
      fStack_3a8 = fStack_858 * -0.00019515296;
      fStack_3a4 = fStack_854 * -0.00019515296;
      local_3c0[0] = 0.008332161;
      local_3c0[1] = 0.008332161;
      afStack_3b8[0] = 0.008332161;
      afStack_3b8[1] = 0.008332161;
      local_870._4_4_ = fStack_3ac + 0.008332161;
      local_870._0_4_ = local_3b0 + 0.008332161;
      uStack_868._0_4_ = fStack_3a8 + 0.008332161;
      uStack_868._4_4_ = fStack_3a4 + 0.008332161;
      local_458 = _ps_sincof_p2;
      local_430 = local_870;
      uStack_428 = uStack_868;
      local_440 = CONCAT44(fStack_85c,local_860);
      uStack_438 = CONCAT44(fStack_854,fStack_858);
      local_410 = (local_3b0 + 0.008332161) * local_860;
      fStack_40c = (fStack_3ac + 0.008332161) * fStack_85c;
      fStack_408 = (fStack_3a8 + 0.008332161) * fStack_858;
      fStack_404 = (fStack_3a4 + 0.008332161) * fStack_854;
      local_420[0] = -0.16666655;
      local_420[1] = -0.16666655;
      afStack_418[0] = -0.16666655;
      afStack_418[1] = -0.16666655;
      local_870._4_4_ = fStack_40c + -0.16666655;
      local_870._0_4_ = local_410 + -0.16666655;
      uStack_868._0_4_ = fStack_408 + -0.16666655;
      uStack_868._4_4_ = fStack_404 + -0.16666655;
      local_6a0 = CONCAT44(fStack_85c,local_860);
      uStack_698 = CONCAT44(fStack_854,fStack_858);
      local_690 = local_870;
      uStack_688 = uStack_868;
      local_870._0_4_ = (local_410 + -0.16666655) * local_860;
      local_870._4_4_ = (fStack_40c + -0.16666655) * fStack_85c;
      fStack_468 = (fStack_408 + -0.16666655) * fStack_858;
      fStack_464 = (fStack_404 + -0.16666655) * fStack_854;
      uStack_868._0_4_ = fStack_468;
      uStack_868._4_4_ = fStack_464;
      local_490 = local_870;
      uStack_488 = uStack_868;
      local_4a0 = local_790;
      uStack_498 = uStack_788;
      local_470 = (float)local_870._0_4_ * fVar90;
      fStack_46c = (float)local_870._4_4_ * fVar91;
      fStack_468 = fStack_468 * fVar92;
      fStack_464 = fStack_464 * fVar93;
      local_480 = local_790;
      uStack_478 = uStack_788;
      local_870._4_4_ = fStack_46c + fVar91;
      local_870._0_4_ = local_470 + fVar90;
      uStack_868._0_4_ = fStack_468 + fVar92;
      uStack_868._4_4_ = fStack_464 + fVar93;
      local_7d0 = local_810._0_8_;
      uStack_7c8 = local_810._8_8_;
      local_740 = local_810._0_8_;
      uStack_738 = local_810._8_8_;
      local_750 = local_870;
      uStack_748 = uStack_868;
      auVar34._8_8_ = uStack_868;
      auVar34._0_8_ = local_870;
      local_880 = vpand_avx(local_810,auVar34);
      local_a0 = local_810._0_8_;
      uStack_98 = local_810._8_8_;
      local_b0 = local_7f0;
      uStack_a8 = uStack_7e8;
      auVar46._8_8_ = uStack_7e8;
      auVar46._0_8_ = local_7f0;
      local_890 = vpandn_avx(local_810,auVar46);
      local_6c0 = local_870;
      uStack_6b8 = uStack_868;
      local_6d0 = local_880._0_8_;
      uStack_6c8 = local_880._8_8_;
      auVar38._8_8_ = uStack_868;
      auVar38._0_8_ = local_870;
      _local_870 = vsubps_avx(auVar38,local_880);
      local_6e0 = local_7f0;
      uStack_6d8 = uStack_7e8;
      local_6f0 = local_890._0_8_;
      uStack_6e8 = local_890._8_8_;
      auVar37._8_8_ = uStack_7e8;
      auVar37._0_8_ = local_7f0;
      _local_7f0 = vsubps_avx(auVar37,local_890);
      local_570 = local_890._0_8_;
      uVar62 = local_570;
      uStack_568 = local_890._8_8_;
      uVar63 = uStack_568;
      local_580 = local_880._0_8_;
      uVar60 = local_580;
      uStack_578 = local_880._8_8_;
      uVar61 = uStack_578;
      local_570._0_4_ = local_890._0_4_;
      local_570._4_4_ = local_890._4_4_;
      uStack_568._0_4_ = local_890._8_4_;
      uStack_568._4_4_ = local_890._12_4_;
      local_580._0_4_ = local_880._0_4_;
      local_580._4_4_ = local_880._4_4_;
      uStack_578._0_4_ = local_880._8_4_;
      uStack_578._4_4_ = local_880._12_4_;
      local_7b0 = CONCAT44(local_570._4_4_ + local_580._4_4_,(float)local_570 + (float)local_580);
      uStack_7a8 = CONCAT44(uStack_568._4_4_ + uStack_578._4_4_,
                            (float)uStack_568 + (float)uStack_578);
      local_590 = local_7f0;
      uVar58 = local_590;
      uStack_588 = uStack_7e8;
      uVar59 = uStack_588;
      local_5a0 = local_870;
      uVar56 = local_5a0;
      uStack_598 = uStack_868;
      uVar57 = uStack_598;
      local_590._0_4_ = local_7f0._0_4_;
      local_590._4_4_ = local_7f0._4_4_;
      uStack_588._0_4_ = local_7f0._8_4_;
      uStack_588._4_4_ = local_7f0._12_4_;
      local_5a0._0_4_ = local_870._0_4_;
      local_5a0._4_4_ = local_870._4_4_;
      uStack_598._0_4_ = local_870._8_4_;
      uStack_598._4_4_ = local_870._12_4_;
      local_7c0 = CONCAT44(local_590._4_4_ + local_5a0._4_4_,(float)local_590 + (float)local_5a0);
      uStack_7b8 = CONCAT44(uStack_588._4_4_ + uStack_598._4_4_,
                            (float)uStack_588 + (float)uStack_598);
      local_e0 = local_7b0;
      uStack_d8 = uStack_7a8;
      local_920._0_8_ = local_7b0 ^ local_f0;
      local_920._8_8_ = uStack_7a8 ^ uStack_e8;
      local_100 = local_7c0;
      uStack_f8 = uStack_7b8;
      local_110 = local_820._0_8_;
      uStack_108 = local_820._8_8_;
      auVar7._8_8_ = uStack_7b8;
      auVar7._0_8_ = local_7c0;
      auVar7 = auVar7 ^ local_820;
      fStack_924 = auVar7._12_4_;
      fStack_928 = auVar7._8_4_;
      fStack_92c = auVar7._4_4_;
      local_930 = auVar7._0_4_;
      local_8c0 = auVar7._0_8_;
      uStack_8b8 = auVar7._8_8_;
      local_70 = 0;
      uStack_68 = local_6b0._8_8_;
      auVar52._8_8_ = 0;
      auVar52._0_8_ = local_6b0._8_8_;
      local_950 = vcmpps_avx(auVar7,auVar52 << 0x40,0);
      local_8f0 = 0x322bcc77322bcc77;
      uStack_8e8 = 0x322bcc77322bcc77;
      local_900 = local_950._0_8_;
      uStack_8f8 = local_950._8_8_;
      auVar33._8_8_ = 0x322bcc77322bcc77;
      auVar33._0_8_ = 0x322bcc77322bcc77;
      local_960 = vpand_avx(auVar33,local_950);
      local_8d0._0_4_ = local_960._0_4_;
      local_8d0._4_4_ = local_960._4_4_;
      uStack_8c8._0_4_ = local_960._8_4_;
      uStack_8c8._4_4_ = local_960._12_4_;
      local_930 = local_930 + (float)local_8d0;
      fStack_92c = fStack_92c + local_8d0._4_4_;
      fStack_928 = fStack_928 + (float)uStack_8c8;
      fStack_924 = fStack_924 + uStack_8c8._4_4_;
      local_50 = CONCAT44(fStack_92c,local_930);
      uStack_48 = CONCAT44(fStack_924,fStack_928);
      auVar48._8_8_ = uStack_48;
      auVar48._0_8_ = local_50;
      local_970 = vdivps_avx(local_920,auVar48);
      local_1db0 = local_970._0_8_;
      uStack_1da8 = local_970._8_8_;
      local_1c70 = local_1d30;
      local_1c80 = local_970._0_8_;
      uStack_1c78 = local_970._8_8_;
      *(undefined1 (*) [16])*local_1d30 = local_970;
      local_1d30 = (undefined1 (*) [32])(*local_1d30 + 0x10);
      local_8d0 = local_960._0_8_;
      uStack_8c8 = local_960._8_8_;
      local_720 = local_910;
      uStack_718 = uStack_908;
      local_700 = local_910;
      uStack_6f8 = uStack_908;
      local_6b0 = local_8e0;
      local_610 = uVar10;
      uStack_608 = uVar11;
      local_5a0 = uVar56;
      uStack_598 = uVar57;
      local_590 = uVar58;
      uStack_588 = uVar59;
      local_580 = uVar60;
      uStack_578 = uVar61;
      local_570 = uVar62;
      uStack_568 = uVar63;
      local_550 = uVar64;
      uStack_548 = uVar65;
      local_4b0 = local_4b8;
      local_450 = local_508;
      local_448 = local_4a8;
      local_3f0 = local_508;
      local_3e8 = local_4a8;
      local_390 = local_508;
      local_388 = local_518;
      local_330 = local_508;
      local_328 = local_518;
      local_2d8 = local_4b8;
      local_2c8 = local_518;
      local_278 = local_4b8;
      local_268 = local_518;
      local_218 = local_4b8;
      local_208 = local_518;
      local_1f0 = uVar8;
      uStack_1e8 = uVar9;
      local_120 = ZEXT816(0) << 0x20;
      local_60 = local_8c0;
      uStack_58 = uStack_8b8;
    }
    for (; local_1d7c < local_1d24; local_1d7c = local_1d7c + 1) {
      local_1bc8 = local_1d09;
      local_1bd0 = local_1d30;
      fVar88 = tanf(*(float *)*local_1d30);
      *(float *)*local_1d30 = fVar88;
      local_1d30 = (undefined1 (*) [32])(*local_1d30 + 4);
    }
  }
  return 0;
}

Assistant:

static int unary_op_inplace(Mat& a, const Option& opt)
{
    Op op;

    int w = a.w;
    int h = a.h;
    int d = a.d;
    int channels = a.c;
    int elempack = a.elempack;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = a.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            _p = op.func_pack16(_p);
            _mm512_storeu_ps(ptr, _p);
            ptr += 16;
        }
#endif // __AVX512F__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _p = op.func_pack8(_p);
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            _p = op.func_pack4(_p);
            _mm_store_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *ptr = op.func(*ptr);
            ptr++;
        }
    }

    return 0;
}